

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# UdpComms.cpp
# Opt level: O0

void __thiscall helics::udp::UdpComms::queue_tx_function(UdpComms *this)

{
  string_view string2;
  string_view string1;
  string_view message;
  string_view message_00;
  string_view message_01;
  string_view message_02;
  string_view message_03;
  string_view message_04;
  string_view message_05;
  string_view message_06;
  string_view message_07;
  string_view message_08;
  string_view message_09;
  string_view message_10;
  string_view message_11;
  string_view message_12;
  string_view message_13;
  string_view message_14;
  format_args args;
  format_args args_00;
  format_args args_01;
  format_args args_02;
  format_args args_03;
  format_args args_04;
  format_args args_05;
  format_args args_06;
  format_args args_07;
  format_args args_08;
  format_args args_09;
  format_args args_10;
  string_view fmt;
  string_view fmt_00;
  string_view fmt_01;
  string_view fmt_02;
  string_view fmt_03;
  string_view fmt_04;
  string_view fmt_05;
  string_view fmt_06;
  string_view fmt_07;
  string_view fmt_08;
  string_view fmt_09;
  string_view fmt_10;
  bool bVar1;
  undefined1 uVar2;
  __int_type _Var3;
  int iVar4;
  ConnectionStatus CVar5;
  BlockingPriorityQueue<std::pair<helics::route_id,_helics::ActionMessage>,_std::mutex,_std::condition_variable>
  *this_00;
  int *piVar6;
  size_t sVar7;
  CommsInterface *this_01;
  int __oflag;
  long in_RDI;
  string_view sVar8;
  pair<std::_Rb_tree_iterator<std::pair<const_helics::route_id,_asio::ip::basic_endpoint<asio::ip::udp>_>_>,_bool>
  pVar9;
  mutable_buffers_1 mVar10;
  __sv_type _Var11;
  string cls_1;
  string cls;
  iterator rt_find;
  exception *err_1;
  query queryNew;
  string port;
  string interface;
  string newroute;
  bool processed;
  ActionMessage cmd_1;
  route_id rid;
  bool continueProcessing;
  results_type result_1;
  query queryLocal_1;
  results_type result;
  query queryLocal;
  endpoint rxEndpoint;
  exception *err;
  query localQuery;
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int> brkprt;
  size_t len;
  endpoint brk;
  vector<char,_std::allocator<char>_> receiveData;
  bool timeout;
  ActionMessage cmd;
  int errorCount;
  time_point startTime;
  bool connectionEstablished;
  int retries;
  query query;
  endpoint broker_endpoint;
  map<helics::route_id,_asio::ip::basic_endpoint<asio::ip::udp>,_std::less<helics::route_id>,_std::allocator<std::pair<const_helics::route_id,_asio::ip::basic_endpoint<asio::ip::udp>_>_>_>
  routes;
  error_code error;
  socket transmitSocket;
  bool closingRx;
  resolver resolver;
  shared_ptr<gmlc::networking::AsioContextManager> ioctx;
  memory_order __b_6;
  memory_order __b_5;
  memory_order __b_4;
  memory_order __b_3;
  memory_order __b_2;
  memory_order __b_1;
  memory_order __b;
  undefined7 in_stack_ffffffffffffe598;
  undefined1 in_stack_ffffffffffffe59f;
  ActionMessage *in_stack_ffffffffffffe5a0;
  undefined4 in_stack_ffffffffffffe5a8;
  ConnectionStatus in_stack_ffffffffffffe5ac;
  undefined4 in_stack_ffffffffffffe5b0;
  flags in_stack_ffffffffffffe5b4;
  undefined4 in_stack_ffffffffffffe5b8;
  action_t in_stack_ffffffffffffe5bc;
  error_code *this_02;
  undefined7 in_stack_ffffffffffffe5c0;
  undefined1 in_stack_ffffffffffffe5c7;
  ActionMessage *in_stack_ffffffffffffe5c8;
  undefined4 in_stack_ffffffffffffe5d0;
  undefined4 in_stack_ffffffffffffe5d4;
  TriggerVariable *in_stack_ffffffffffffe5d8;
  undefined4 in_stack_ffffffffffffe5e0;
  BaseType in_stack_ffffffffffffe5e4;
  iterator in_stack_ffffffffffffe5e8;
  promise<int> *in_stack_ffffffffffffe5f0;
  int32_t in_stack_ffffffffffffe5f8;
  undefined4 in_stack_ffffffffffffe5fc;
  basic_resolver_entry<asio::ip::udp> *in_stack_ffffffffffffe608;
  undefined4 in_stack_ffffffffffffe610;
  int32_t in_stack_ffffffffffffe614;
  undefined1 *in_stack_ffffffffffffe618;
  char *in_stack_ffffffffffffe620;
  undefined4 in_stack_ffffffffffffe628;
  undefined4 in_stack_ffffffffffffe62c;
  udp in_stack_ffffffffffffe6a8;
  undefined4 in_stack_ffffffffffffe6ac;
  byte local_18e1;
  undefined1 local_1858 [32];
  char *local_1838;
  undefined8 local_1830;
  undefined1 local_1828 [32];
  size_t local_1808;
  unsigned_long_long in_stack_ffffffffffffe800;
  anon_union_8_2_de49483c_for_basic_format_args<fmt::v11::context>_2 in_stack_ffffffffffffe808;
  anon_union_8_2_de49483c_for_basic_format_args<fmt::v11::context>_2 aVar12;
  char *in_stack_ffffffffffffe810;
  char *pcVar13;
  size_t in_stack_ffffffffffffe818;
  int local_17ac;
  duration<long,std::ratio<1l,1000l>> local_17a8 [8];
  ActionMessage *in_stack_ffffffffffffe860;
  undefined1 local_1770 [32];
  __sv_type local_1750;
  mutable_buffer local_1740;
  error_code local_1729 [2];
  int local_1704;
  duration<long,std::ratio<1l,1000l>> local_1700 [47];
  undefined1 local_16d1 [121];
  undefined8 local_1658;
  undefined1 local_1650 [32];
  __sv_type local_1630;
  const_buffer local_1600;
  undefined1 local_15f0 [36];
  BaseType local_15cc;
  char *local_15c8;
  undefined8 local_15c0;
  undefined1 local_15b8 [32];
  __sv_type local_1598;
  const_buffer local_1568;
  _Self local_1558;
  _Self local_1550;
  undefined1 local_1548 [32];
  char *local_1528;
  undefined8 local_1520;
  undefined1 local_1518 [32];
  __sv_type local_14f8;
  const_buffer local_14c8;
  undefined4 local_14b4;
  undefined1 local_14b0 [32];
  char *local_1490;
  undefined8 local_1488;
  undefined1 local_1480 [32];
  __sv_type local_1460;
  undefined1 local_1450 [32];
  char *local_1430;
  undefined8 local_1428;
  undefined1 local_1420 [32];
  __sv_type local_1400;
  const_buffer local_13d0;
  undefined4 local_13bc;
  undefined1 local_13b8 [32];
  char *local_1398;
  undefined8 local_1390;
  undefined1 local_1388 [32];
  __sv_type local_1368;
  const_buffer local_1338;
  route_id local_1324 [21];
  _Base_ptr local_12d0;
  undefined1 local_12c8;
  route_id local_12a8;
  int local_12a4;
  undefined1 local_1230 [16];
  char local_1220 [135];
  allocator<char> local_1199;
  string_view local_1198;
  undefined4 local_1168;
  byte local_1161;
  int local_108c;
  route_id local_fd4;
  byte local_fcd;
  char *local_fb0;
  undefined8 local_fa8;
  undefined1 local_fa0 [32];
  __sv_type local_f80;
  int local_f34;
  allocator<char> local_e61 [37];
  int local_e3c;
  __int_type local_da8;
  undefined4 local_d50;
  int local_d4c;
  duration<long,std::ratio<1l,1l>> local_d48 [100];
  int local_ce4;
  undefined4 local_c50;
  __int_type local_c34;
  int local_b74;
  duration<long,std::ratio<1l,1000l>> local_b70 [8];
  undefined1 local_b68 [32];
  char *local_b48;
  undefined8 local_b40;
  undefined1 local_b38 [32];
  __sv_type local_b18;
  undefined4 local_b08;
  __unspec local_b01;
  undefined8 local_b00;
  rep local_af8;
  type local_ae9;
  undefined1 local_ae8 [32];
  char *local_ac8;
  undefined8 local_ac0;
  undefined1 local_ab8 [32];
  __sv_type local_a98;
  mutable_buffer local_a88;
  size_t local_a78;
  undefined4 local_a6c;
  int local_a54;
  duration<long,std::ratio<1l,1000l>> local_a50 [8];
  undefined4 local_a48;
  __unspec local_a41;
  undefined8 local_a40;
  rep local_a38;
  type local_a29;
  allocator<char> local_a09 [28];
  byte local_9ed;
  undefined4 local_9ec;
  undefined1 local_9e8 [32];
  char *local_9c8;
  undefined8 local_9c0;
  undefined1 local_9b8 [32];
  __sv_type local_998;
  const_buffer local_968;
  __sv_type local_958;
  __sv_type local_948;
  int local_934;
  uint local_87c;
  undefined4 local_878;
  int local_874;
  undefined8 local_870;
  byte local_865;
  int local_864;
  int local_804;
  error_code local_740;
  __int_type local_730;
  int local_72c;
  basic_socket<asio::ip::udp,_asio::any_io_executor> local_728;
  byte local_6c9;
  int local_62c;
  memory_order local_628;
  int local_624;
  int *local_620;
  int local_614;
  memory_order local_610;
  int local_60c;
  int *local_608;
  int local_5fc;
  memory_order local_5f8;
  int local_5f4;
  int *local_5f0;
  int local_5e4;
  memory_order local_5e0;
  int local_5dc;
  int *local_5d8;
  int local_5cc;
  memory_order local_5c8;
  int local_5c4;
  int *local_5c0;
  int local_5b4;
  memory_order local_5b0;
  int local_5ac;
  int *local_5a8;
  int local_59c;
  memory_order local_598;
  int local_594;
  int *local_590;
  undefined1 local_588 [16];
  undefined8 local_578;
  undefined1 *local_570;
  char *local_568;
  undefined8 uStack_560;
  undefined1 *local_558;
  char *local_550;
  undefined8 uStack_548;
  undefined1 *local_540;
  undefined1 local_538 [16];
  undefined8 local_528;
  undefined1 *local_520;
  char *local_518;
  undefined8 uStack_510;
  undefined1 *local_508;
  char *local_500;
  undefined8 uStack_4f8;
  undefined1 *local_4f0;
  undefined1 local_4e8 [16];
  undefined8 local_4d8;
  undefined1 *local_4d0;
  char *local_4c8;
  undefined8 uStack_4c0;
  undefined1 *local_4b8;
  char *local_4b0;
  undefined8 uStack_4a8;
  undefined1 *local_4a0;
  undefined1 local_498 [16];
  undefined8 local_488;
  undefined1 *local_480;
  char *local_478;
  undefined8 uStack_470;
  undefined1 *local_468;
  char *local_460;
  undefined8 uStack_458;
  undefined1 *local_450;
  undefined1 local_448 [16];
  undefined8 local_438;
  undefined1 *local_430;
  char *local_428;
  undefined8 uStack_420;
  undefined1 *local_418;
  char *local_410;
  undefined8 uStack_408;
  undefined1 *local_400;
  undefined1 local_3f8 [16];
  undefined8 local_3e8;
  undefined1 *local_3e0;
  char *local_3d8;
  undefined8 uStack_3d0;
  undefined1 *local_3c8;
  char *local_3c0;
  undefined8 uStack_3b8;
  undefined1 *local_3b0;
  undefined1 local_3a8 [16];
  undefined8 local_398;
  undefined1 *local_390;
  char *local_388;
  undefined8 uStack_380;
  undefined1 *local_378;
  char *local_370;
  undefined8 uStack_368;
  undefined1 *local_360;
  undefined1 local_358 [16];
  undefined8 local_348;
  undefined1 *local_340;
  char *local_338;
  undefined8 uStack_330;
  undefined1 *local_328;
  char *local_320;
  undefined8 uStack_318;
  undefined1 *local_310;
  undefined1 local_308 [16];
  undefined8 local_2f8;
  undefined1 *local_2f0;
  char *local_2e8;
  undefined8 uStack_2e0;
  undefined1 *local_2d8;
  char *local_2d0;
  undefined8 uStack_2c8;
  undefined1 *local_2c0;
  undefined1 local_2b8 [16];
  undefined8 local_2a8;
  undefined1 *local_2a0;
  char *local_298;
  undefined8 uStack_290;
  undefined1 *local_288;
  char *local_280;
  undefined8 uStack_278;
  undefined1 *local_270;
  undefined1 local_1c8 [16];
  undefined8 local_1b8;
  undefined1 *local_1b0;
  char *local_1a8;
  undefined8 uStack_1a0;
  long local_198;
  char *local_190;
  undefined8 uStack_188;
  undefined1 *local_180;
  BaseType local_178 [8];
  undefined8 local_158;
  BaseType *local_150;
  char *local_148;
  undefined8 uStack_140;
  undefined1 *local_138;
  BaseType *local_130;
  char *local_128;
  undefined8 uStack_120;
  undefined1 *local_118;
  undefined1 *local_f0;
  undefined8 *local_e8;
  undefined1 *local_e0;
  undefined8 *local_d8;
  undefined1 *local_d0;
  undefined8 *local_c8;
  undefined1 *local_c0;
  undefined8 *local_b8;
  undefined1 *local_b0;
  undefined8 *local_a8;
  undefined1 *local_a0;
  undefined8 *local_98;
  undefined1 *local_90;
  undefined8 *local_88;
  undefined1 *local_80;
  undefined8 *local_78;
  undefined1 *local_70;
  undefined8 *local_68;
  undefined1 *local_60;
  undefined8 *local_58;
  undefined1 *local_50;
  undefined8 *local_48;
  BaseType local_1c;
  BaseType *local_18;
  BaseType *local_10;
  undefined8 *local_8;
  
  std::__cxx11::string::string
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             CONCAT44(in_stack_ffffffffffffe5b4,in_stack_ffffffffffffe5b0));
  gmlc::networking::AsioContextManager::getContextPointer
            ((string *)CONCAT44(in_stack_ffffffffffffe62c,in_stack_ffffffffffffe628));
  std::__cxx11::string::~string
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             in_stack_ffffffffffffe5a0);
  std::
  __shared_ptr_access<gmlc::networking::AsioContextManager,_(__gnu_cxx::_Lock_policy)2,_false,_false>
  ::operator->((__shared_ptr_access<gmlc::networking::AsioContextManager,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                *)0x473025);
  gmlc::networking::AsioContextManager::getBaseContext((AsioContextManager *)0x47302d);
  asio::ip::basic_resolver<asio::ip::udp,_asio::any_io_executor>::basic_resolver<asio::io_context>
            ((basic_resolver<asio::ip::udp,_asio::any_io_executor> *)
             CONCAT17(in_stack_ffffffffffffe5c7,in_stack_ffffffffffffe5c0),
             (io_context *)CONCAT44(in_stack_ffffffffffffe5bc,in_stack_ffffffffffffe5b8),
             in_stack_ffffffffffffe5b4);
  local_6c9 = 0;
  std::
  __shared_ptr_access<gmlc::networking::AsioContextManager,_(__gnu_cxx::_Lock_policy)2,_false,_false>
  ::operator->((__shared_ptr_access<gmlc::networking::AsioContextManager,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                *)0x473065);
  this_00 = (BlockingPriorityQueue<std::pair<helics::route_id,_helics::ActionMessage>,_std::mutex,_std::condition_variable>
             *)gmlc::networking::AsioContextManager::getBaseContext((AsioContextManager *)0x47306d);
  asio::basic_datagram_socket<asio::ip::udp,_asio::any_io_executor>::
  basic_datagram_socket<asio::io_context>
            ((basic_datagram_socket<asio::ip::udp,_asio::any_io_executor> *)
             in_stack_ffffffffffffe5a0,
             (io_context *)CONCAT17(in_stack_ffffffffffffe59f,in_stack_ffffffffffffe598),0);
  local_72c = (int)udpnet(LOCAL);
  asio::basic_socket<asio::ip::udp,_asio::any_io_executor>::open
            (&local_728,(char *)&local_72c,__oflag);
  _Var3 = std::__atomic_base::operator_cast_to_int
                    ((__atomic_base<int> *)
                     CONCAT44(in_stack_ffffffffffffe5ac,in_stack_ffffffffffffe5a8));
  if (-1 < _Var3) {
    local_730 = std::__atomic_base::operator_cast_to_int
                          ((__atomic_base<int> *)
                           CONCAT44(in_stack_ffffffffffffe5ac,in_stack_ffffffffffffe5a8));
    std::promise<int>::set_value(in_stack_ffffffffffffe5f0,(int *)in_stack_ffffffffffffe5e8._M_node)
    ;
  }
  CLI::std::error_code::error_code((error_code *)in_stack_ffffffffffffe5a0);
  std::
  map<helics::route_id,_asio::ip::basic_endpoint<asio::ip::udp>,_std::less<helics::route_id>,_std::allocator<std::pair<const_helics::route_id,_asio::ip::basic_endpoint<asio::ip::udp>_>_>_>
  ::map((map<helics::route_id,_asio::ip::basic_endpoint<asio::ip::udp>,_std::less<helics::route_id>,_std::allocator<std::pair<const_helics::route_id,_asio::ip::basic_endpoint<asio::ip::udp>_>_>_>
         *)0x4731bf);
  asio::ip::basic_endpoint<asio::ip::udp>::basic_endpoint((basic_endpoint<asio::ip::udp> *)0x4731cc)
  ;
  bVar1 = CLI::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
          empty((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x4731e0);
  if (!bVar1) {
    std::atomic<bool>::operator=
              ((atomic<bool> *)in_stack_ffffffffffffe5a0,(bool)in_stack_ffffffffffffe59f);
  }
  bVar1 = std::atomic::operator_cast_to_bool
                    ((atomic<bool> *)CONCAT44(in_stack_ffffffffffffe5ac,in_stack_ffffffffffffe5a8));
  if (bVar1) {
    if (*(int *)(in_RDI + 0x410) < 0) {
      iVar4 = getDefaultBrokerPort((UdpComms *)0x473238);
      *(int *)(in_RDI + 0x410) = iVar4;
    }
    local_804 = (int)udpnet(LOCAL);
    CLI::std::__cxx11::to_string((int)((ulong)in_stack_ffffffffffffe5d8 >> 0x20));
    asio::ip::basic_resolver_query<asio::ip::udp>::basic_resolver_query
              ((basic_resolver_query<asio::ip::udp> *)
               CONCAT44(in_stack_ffffffffffffe5d4,in_stack_ffffffffffffe5d0),
               (protocol_type *)in_stack_ffffffffffffe5c8,
               (string *)CONCAT17(in_stack_ffffffffffffe5c7,in_stack_ffffffffffffe5c0),
               (string *)CONCAT44(in_stack_ffffffffffffe5bc,in_stack_ffffffffffffe5b8),
               in_stack_ffffffffffffe5b4);
    std::__cxx11::string::~string
              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               in_stack_ffffffffffffe5a0);
    asio::ip::basic_resolver<asio::ip::udp,_asio::any_io_executor>::resolve
              ((basic_resolver<asio::ip::udp,_asio::any_io_executor> *)
               in_stack_ffffffffffffe5e8._M_node,
               (query *)CONCAT44(in_stack_ffffffffffffe5e4,in_stack_ffffffffffffe5e0));
    asio::ip::basic_resolver_iterator<asio::ip::udp>::operator*
              ((basic_resolver_iterator<asio::ip::udp> *)0x473331);
    asio::ip::basic_resolver_entry::operator_cast_to_basic_endpoint
              ((basic_resolver_entry<asio::ip::udp> *)
               CONCAT17(in_stack_ffffffffffffe59f,in_stack_ffffffffffffe598));
    asio::ip::basic_endpoint<asio::ip::udp>::operator=
              ((basic_endpoint<asio::ip::udp> *)in_stack_ffffffffffffe5a0,
               (basic_endpoint<asio::ip::udp> *)
               CONCAT17(in_stack_ffffffffffffe59f,in_stack_ffffffffffffe598));
    asio::ip::basic_resolver_results<asio::ip::udp>::~basic_resolver_results
              ((basic_resolver_results<asio::ip::udp> *)0x473374);
    local_864 = 0;
    local_865 = 0;
    piVar6 = (int *)(in_RDI + 0x414);
    local_594 = 5;
    local_590 = piVar6;
    local_598 = CLI::std::operator&(seq_cst,__memory_order_mask);
    if (local_594 - 1U < 2) {
      local_59c = *piVar6;
    }
    else if (local_594 == 5) {
      local_59c = *piVar6;
    }
    else {
      local_59c = *piVar6;
    }
    if ((0 < local_59c) && ((*(byte *)(in_RDI + 0x41b) & 1) != 0)) {
      local_865 = 1;
    }
    local_870 = std::chrono::_V2::steady_clock::now();
    local_874 = 0;
    do {
      if (((local_865 ^ 0xff) & 1) == 0) {
        local_87c = 0;
        break;
      }
      bVar1 = std::atomic<bool>::load
                        ((atomic<bool> *)
                         CONCAT44(in_stack_ffffffffffffe5ac,in_stack_ffffffffffffe5a8),
                         (memory_order)((ulong)in_stack_ffffffffffffe5a0 >> 0x20));
      if (bVar1) {
        piVar6 = (int *)(in_RDI + 0x414);
        local_5ac = 5;
        local_5a8 = piVar6;
        local_5b0 = CLI::std::operator&(seq_cst,__memory_order_mask);
        if (local_5ac - 1U < 2) {
          local_5b4 = *piVar6;
        }
        else if (local_5ac == 5) {
          local_5b4 = *piVar6;
        }
        else {
          local_5b4 = *piVar6;
        }
        if (local_5b4 < 1) {
          std::__atomic_base<int>::operator=
                    ((__atomic_base<int> *)
                     CONCAT44(in_stack_ffffffffffffe5ac,in_stack_ffffffffffffe5a8),
                     (__int_type)((ulong)in_stack_ffffffffffffe5a0 >> 0x20));
          local_878 = 0xffffffff;
          std::promise<int>::set_value
                    (in_stack_ffffffffffffe5f0,(int *)in_stack_ffffffffffffe5e8._M_node);
        }
        CommsInterface::setTxStatus
                  ((CommsInterface *)CONCAT44(in_stack_ffffffffffffe5b4,in_stack_ffffffffffffe5b0),
                   in_stack_ffffffffffffe5ac);
        local_87c = 1;
        break;
      }
      ActionMessage::ActionMessage
                ((ActionMessage *)CONCAT17(in_stack_ffffffffffffe5c7,in_stack_ffffffffffffe5c0),
                 in_stack_ffffffffffffe5bc);
      _Var3 = std::__atomic_base::operator_cast_to_int
                        ((__atomic_base<int> *)
                         CONCAT44(in_stack_ffffffffffffe5ac,in_stack_ffffffffffffe5a8));
      local_934 = 0x12d;
      if (_Var3 < 1) {
        local_934 = 0x5af;
      }
      local_948 = std::__cxx11::string::operator_cast_to_basic_string_view
                            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                             in_stack_ffffffffffffe5a0);
      local_958 = std::__cxx11::string::operator_cast_to_basic_string_view
                            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                             in_stack_ffffffffffffe5a0);
      string1._M_len._4_4_ = in_stack_ffffffffffffe5bc;
      string1._M_len._0_4_ = in_stack_ffffffffffffe5b8;
      string1._M_str._0_7_ = in_stack_ffffffffffffe5c0;
      string1._M_str._7_1_ = in_stack_ffffffffffffe5c7;
      string2._M_len._4_4_ = in_stack_ffffffffffffe5ac;
      string2._M_len._0_4_ = in_stack_ffffffffffffe5a8;
      string2._M_str._0_4_ = in_stack_ffffffffffffe5b0;
      string2._M_str._4_4_ = in_stack_ffffffffffffe5b4;
      ActionMessage::setStringData(in_stack_ffffffffffffe5a0,string1,string2);
      ActionMessage::to_string_abi_cxx11_
                ((ActionMessage *)CONCAT44(in_stack_ffffffffffffe5fc,in_stack_ffffffffffffe5f8));
      local_968 = (const_buffer)
                  asio::buffer<char,std::char_traits<char>,std::allocator<char>>
                            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                             in_stack_ffffffffffffe5a0);
      asio::basic_datagram_socket<asio::ip::udp,_asio::any_io_executor>::
      send_to<asio::const_buffers_1>
                ((basic_datagram_socket<asio::ip::udp,_asio::any_io_executor> *)
                 CONCAT17(in_stack_ffffffffffffe5c7,in_stack_ffffffffffffe5c0),
                 (const_buffers_1 *)CONCAT44(in_stack_ffffffffffffe5bc,in_stack_ffffffffffffe5b8),
                 (endpoint_type *)CONCAT44(in_stack_ffffffffffffe5b4,in_stack_ffffffffffffe5b0),
                 in_stack_ffffffffffffe5ac,(error_code *)in_stack_ffffffffffffe5a0);
      std::__cxx11::string::~string
                ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 in_stack_ffffffffffffe5a0);
      bVar1 = std::error_code::operator_cast_to_bool(&local_740);
      if (bVar1) {
        local_9c8 = "error in initial send to broker {}";
        local_9c0 = 0x22;
        std::error_code::message_abi_cxx11_
                  ((error_code *)CONCAT44(in_stack_ffffffffffffe5bc,in_stack_ffffffffffffe5b8));
        local_270 = local_9b8;
        local_280 = local_9c8;
        uStack_278 = local_9c0;
        local_288 = local_9e8;
        local_298 = local_9c8;
        uStack_290 = local_9c0;
        ::fmt::v11::detail::value<fmt::v11::context>::
        value<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_char,_0>
                  ((value<fmt::v11::context> *)
                   CONCAT44(in_stack_ffffffffffffe5b4,in_stack_ffffffffffffe5b0),
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   CONCAT44(in_stack_ffffffffffffe5ac,in_stack_ffffffffffffe5a8));
        local_d8 = &local_2a8;
        local_e0 = local_2b8;
        local_2a8 = 0xd;
        fmt.size_ = in_stack_ffffffffffffe818;
        fmt.data_ = in_stack_ffffffffffffe810;
        args.field_1.values_ = in_stack_ffffffffffffe808.values_;
        args.desc_ = in_stack_ffffffffffffe800;
        local_2a0 = local_e0;
        ::fmt::v11::vformat_abi_cxx11_(fmt,args);
        local_998 = std::__cxx11::string::operator_cast_to_basic_string_view
                              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                               in_stack_ffffffffffffe5a0);
        message._M_str = in_stack_ffffffffffffe620;
        message._M_len = (size_t)in_stack_ffffffffffffe618;
        CommsInterface::logError
                  ((CommsInterface *)CONCAT44(in_stack_ffffffffffffe614,in_stack_ffffffffffffe610),
                   message);
        std::__cxx11::string::~string
                  ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   in_stack_ffffffffffffe5a0);
        std::__cxx11::string::~string
                  ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   in_stack_ffffffffffffe5a0);
        piVar6 = (int *)(in_RDI + 0x414);
        local_5c4 = 5;
        local_5c0 = piVar6;
        local_5c8 = CLI::std::operator&(seq_cst,__memory_order_mask);
        if (local_5c4 - 1U < 2) {
          local_5cc = *piVar6;
        }
        else if (local_5c4 == 5) {
          local_5cc = *piVar6;
        }
        else {
          local_5cc = *piVar6;
        }
        if (local_5cc < 1) {
          std::__atomic_base<int>::operator=
                    ((__atomic_base<int> *)
                     CONCAT44(in_stack_ffffffffffffe5ac,in_stack_ffffffffffffe5a8),
                     (__int_type)((ulong)in_stack_ffffffffffffe5a0 >> 0x20));
          local_9ec = 0xffffffff;
          std::promise<int>::set_value
                    (in_stack_ffffffffffffe5f0,(int *)in_stack_ffffffffffffe5e8._M_node);
        }
        CommsInterface::setTxStatus
                  ((CommsInterface *)CONCAT44(in_stack_ffffffffffffe5b4,in_stack_ffffffffffffe5b0),
                   in_stack_ffffffffffffe5ac);
        local_87c = 1;
      }
      else {
        local_9ed = 0;
        std::allocator<char>::allocator();
        std::vector<char,_std::allocator<char>_>::vector
                  ((vector<char,_std::allocator<char>_> *)
                   CONCAT17(in_stack_ffffffffffffe5c7,in_stack_ffffffffffffe5c0),
                   CONCAT44(in_stack_ffffffffffffe5bc,in_stack_ffffffffffffe5b8),
                   (allocator_type *)CONCAT44(in_stack_ffffffffffffe5b4,in_stack_ffffffffffffe5b0));
        std::allocator<char>::~allocator(local_a09);
        asio::ip::basic_endpoint<asio::ip::udp>::basic_endpoint
                  ((basic_endpoint<asio::ip::udp> *)0x473ac3);
        while( true ) {
          sVar7 = asio::basic_socket<asio::ip::udp,_asio::any_io_executor>::available
                            ((basic_socket<asio::ip::udp,_asio::any_io_executor> *)
                             CONCAT17(in_stack_ffffffffffffe5c7,in_stack_ffffffffffffe5c0));
          local_18e1 = 0;
          if (sVar7 == 0) {
            local_18e1 = local_9ed ^ 0xff;
          }
          if ((local_18e1 & 1) == 0) {
            if ((local_9ed & 1) != 0) {
              local_864 = local_864 + 1;
              if (*(int *)(in_RDI + 0x424) < local_864) {
                CLI::std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
                          ((basic_string_view<char,_std::char_traits<char>_> *)
                           CONCAT44(in_stack_ffffffffffffe5b4,in_stack_ffffffffffffe5b0),
                           (char *)CONCAT44(in_stack_ffffffffffffe5ac,in_stack_ffffffffffffe5a8));
                message_00._M_str = in_stack_ffffffffffffe620;
                message_00._M_len = (size_t)in_stack_ffffffffffffe618;
                CommsInterface::logError
                          ((CommsInterface *)
                           CONCAT44(in_stack_ffffffffffffe614,in_stack_ffffffffffffe610),message_00)
                ;
                piVar6 = (int *)(in_RDI + 0x414);
                local_5f4 = 5;
                local_5f0 = piVar6;
                local_5f8 = CLI::std::operator&(seq_cst,__memory_order_mask);
                if (local_5f4 - 1U < 2) {
                  local_5fc = *piVar6;
                }
                else if (local_5f4 == 5) {
                  local_5fc = *piVar6;
                }
                else {
                  local_5fc = *piVar6;
                }
                if (local_5fc < 1) {
                  std::__atomic_base<int>::operator=
                            ((__atomic_base<int> *)
                             CONCAT44(in_stack_ffffffffffffe5ac,in_stack_ffffffffffffe5a8),
                             (__int_type)((ulong)in_stack_ffffffffffffe5a0 >> 0x20));
                  local_a6c = 0xffffffff;
                  std::promise<int>::set_value
                            (in_stack_ffffffffffffe5f0,(int *)in_stack_ffffffffffffe5e8._M_node);
                }
                CommsInterface::setTxStatus
                          ((CommsInterface *)
                           CONCAT44(in_stack_ffffffffffffe5b4,in_stack_ffffffffffffe5b0),
                           in_stack_ffffffffffffe5ac);
                local_87c = 1;
              }
              else {
                local_87c = 2;
              }
              goto LAB_004749df;
            }
            local_a88 = (mutable_buffer)
                        asio::buffer<char,std::allocator<char>>
                                  ((vector<char,_std::allocator<char>_> *)in_stack_ffffffffffffe5a0)
            ;
            local_a78 = asio::basic_datagram_socket<asio::ip::udp,_asio::any_io_executor>::
                        receive_from<asio::mutable_buffers_1>
                                  ((basic_datagram_socket<asio::ip::udp,_asio::any_io_executor> *)
                                   CONCAT17(in_stack_ffffffffffffe5c7,in_stack_ffffffffffffe5c0),
                                   (mutable_buffers_1 *)
                                   CONCAT44(in_stack_ffffffffffffe5bc,in_stack_ffffffffffffe5b8),
                                   (endpoint_type *)
                                   CONCAT44(in_stack_ffffffffffffe5b4,in_stack_ffffffffffffe5b0),
                                   in_stack_ffffffffffffe5ac,(error_code *)in_stack_ffffffffffffe5a0
                                  );
            bVar1 = std::error_code::operator_cast_to_bool(&local_740);
            if (bVar1) {
              iVar4 = local_874 + 1;
              bVar1 = local_874 == 0;
              local_874 = iVar4;
              if (bVar1) {
                local_ac8 = "error in initial receive broker {}";
                local_ac0 = 0x22;
                std::error_code::message_abi_cxx11_
                          ((error_code *)
                           CONCAT44(in_stack_ffffffffffffe5bc,in_stack_ffffffffffffe5b8));
                local_2c0 = local_ab8;
                local_2d0 = local_ac8;
                uStack_2c8 = local_ac0;
                local_2d8 = local_ae8;
                local_2e8 = local_ac8;
                uStack_2e0 = local_ac0;
                ::fmt::v11::detail::value<fmt::v11::context>::
                value<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_char,_0>
                          ((value<fmt::v11::context> *)
                           CONCAT44(in_stack_ffffffffffffe5b4,in_stack_ffffffffffffe5b0),
                           (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                           CONCAT44(in_stack_ffffffffffffe5ac,in_stack_ffffffffffffe5a8));
                local_c8 = &local_2f8;
                local_d0 = local_308;
                local_2f8 = 0xd;
                fmt_00.size_ = in_stack_ffffffffffffe818;
                fmt_00.data_ = in_stack_ffffffffffffe810;
                args_00.field_1.values_ = in_stack_ffffffffffffe808.values_;
                args_00.desc_ = in_stack_ffffffffffffe800;
                local_2f0 = local_d0;
                ::fmt::v11::vformat_abi_cxx11_(fmt_00,args_00);
                local_a98 = std::__cxx11::string::operator_cast_to_basic_string_view
                                      ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                        *)in_stack_ffffffffffffe5a0);
                message_01._M_str = in_stack_ffffffffffffe620;
                message_01._M_len = (size_t)in_stack_ffffffffffffe618;
                CommsInterface::logError
                          ((CommsInterface *)
                           CONCAT44(in_stack_ffffffffffffe614,in_stack_ffffffffffffe610),message_01)
                ;
                std::__cxx11::string::~string
                          ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                           in_stack_ffffffffffffe5a0);
                std::__cxx11::string::~string
                          ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                           in_stack_ffffffffffffe5a0);
              }
              local_b00 = std::chrono::_V2::steady_clock::now();
              local_af8 = (rep)std::chrono::operator-
                                         ((time_point<std::chrono::_V2::steady_clock,_std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_>
                                           *)CONCAT44(in_stack_ffffffffffffe5ac,
                                                      in_stack_ffffffffffffe5a8),
                                          (time_point<std::chrono::_V2::steady_clock,_std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_>
                                           *)in_stack_ffffffffffffe5a0);
              local_ae9 = (type)std::chrono::
                                operator<=><long,_std::ratio<1L,_1000000000L>,_long,_std::ratio<1L,_1000L>_>
                                          ((duration<long,_std::ratio<1L,_1000000000L>_> *)
                                           in_stack_ffffffffffffe5c8,
                                           (duration<long,_std::ratio<1L,_1000L>_> *)
                                           CONCAT17(in_stack_ffffffffffffe5c7,
                                                    in_stack_ffffffffffffe5c0));
              CLI::std::__cmp_cat::__unspec::__unspec(&local_b01,(__unspec *)0x0);
              bVar1 = std::operator>(local_ae9);
              if (bVar1) {
                piVar6 = (int *)(in_RDI + 0x414);
                local_60c = 5;
                local_608 = piVar6;
                local_610 = CLI::std::operator&(seq_cst,__memory_order_mask);
                if (local_60c - 1U < 2) {
                  local_614 = *piVar6;
                }
                else if (local_60c == 5) {
                  local_614 = *piVar6;
                }
                else {
                  local_614 = *piVar6;
                }
                if (local_614 < 1) {
                  std::__atomic_base<int>::operator=
                            ((__atomic_base<int> *)
                             CONCAT44(in_stack_ffffffffffffe5ac,in_stack_ffffffffffffe5a8),
                             (__int_type)((ulong)in_stack_ffffffffffffe5a0 >> 0x20));
                  local_b08 = 0xffffffff;
                  std::promise<int>::set_value
                            (in_stack_ffffffffffffe5f0,(int *)in_stack_ffffffffffffe5e8._M_node);
                }
                CommsInterface::setTxStatus
                          ((CommsInterface *)
                           CONCAT44(in_stack_ffffffffffffe5b4,in_stack_ffffffffffffe5b0),
                           in_stack_ffffffffffffe5ac);
                local_b48 = "timeerror in broker receive {}";
                local_b40 = 0x1e;
                std::error_code::message_abi_cxx11_
                          ((error_code *)
                           CONCAT44(in_stack_ffffffffffffe5bc,in_stack_ffffffffffffe5b8));
                local_310 = local_b38;
                local_320 = local_b48;
                uStack_318 = local_b40;
                local_328 = local_b68;
                local_338 = local_b48;
                uStack_330 = local_b40;
                ::fmt::v11::detail::value<fmt::v11::context>::
                value<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_char,_0>
                          ((value<fmt::v11::context> *)
                           CONCAT44(in_stack_ffffffffffffe5b4,in_stack_ffffffffffffe5b0),
                           (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                           CONCAT44(in_stack_ffffffffffffe5ac,in_stack_ffffffffffffe5a8));
                local_b8 = &local_348;
                local_c0 = local_358;
                local_348 = 0xd;
                fmt_01.size_ = in_stack_ffffffffffffe818;
                fmt_01.data_ = in_stack_ffffffffffffe810;
                args_01.field_1.values_ = in_stack_ffffffffffffe808.values_;
                args_01.desc_ = in_stack_ffffffffffffe800;
                local_340 = local_c0;
                ::fmt::v11::vformat_abi_cxx11_(fmt_01,args_01);
                local_b18 = std::__cxx11::string::operator_cast_to_basic_string_view
                                      ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                        *)in_stack_ffffffffffffe5a0);
                message_02._M_str = in_stack_ffffffffffffe620;
                message_02._M_len = (size_t)in_stack_ffffffffffffe618;
                CommsInterface::logError
                          ((CommsInterface *)
                           CONCAT44(in_stack_ffffffffffffe614,in_stack_ffffffffffffe610),message_02)
                ;
                std::__cxx11::string::~string
                          ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                           in_stack_ffffffffffffe5a0);
                std::__cxx11::string::~string
                          ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                           in_stack_ffffffffffffe5a0);
                local_87c = 1;
              }
              else {
                local_b74 = 200;
                std::chrono::duration<long,std::ratio<1l,1000l>>::duration<int,void>
                          (local_b70,&local_b74);
                std::this_thread::sleep_for<long,std::ratio<1l,1000l>>
                          ((duration<long,_std::ratio<1L,_1000L>_> *)
                           CONCAT44(in_stack_ffffffffffffe5e4,in_stack_ffffffffffffe5e0));
                local_87c = 2;
              }
              goto LAB_004749df;
            }
            CLI::std::vector<char,_std::allocator<char>_>::data
                      ((vector<char,_std::allocator<char>_> *)0x4744c5);
            ActionMessage::ActionMessage
                      ((ActionMessage *)
                       CONCAT44(in_stack_ffffffffffffe5d4,in_stack_ffffffffffffe5d0),
                       in_stack_ffffffffffffe5c8,
                       CONCAT17(in_stack_ffffffffffffe5c7,in_stack_ffffffffffffe5c0));
            ActionMessage::operator=
                      (in_stack_ffffffffffffe5a0,
                       (ActionMessage *)
                       CONCAT17(in_stack_ffffffffffffe59f,in_stack_ffffffffffffe598));
            ActionMessage::~ActionMessage(in_stack_ffffffffffffe5a0);
            bVar1 = isProtocolCommand(in_stack_ffffffffffffe5a0);
            if (bVar1) {
              if (local_934 == 0x5ab) {
                NetworkCommsInterface::loadPortDefinitions
                          ((NetworkCommsInterface *)
                           CONCAT44(in_stack_ffffffffffffe5d4,in_stack_ffffffffffffe5d0),
                           in_stack_ffffffffffffe5c8);
                local_c34 = std::__atomic_base::operator_cast_to_int
                                      ((__atomic_base<int> *)
                                       CONCAT44(in_stack_ffffffffffffe5ac,in_stack_ffffffffffffe5a8)
                                      );
                std::promise<int>::set_value
                          (in_stack_ffffffffffffe5f0,(int *)in_stack_ffffffffffffe5e8._M_node);
                local_865 = 1;
              }
              else if (local_934 == 0x130) {
                piVar6 = (int *)(in_RDI + 0x414);
                local_624 = 5;
                local_620 = piVar6;
                local_628 = CLI::std::operator&(seq_cst,__memory_order_mask);
                if (local_624 - 1U < 2) {
                  local_62c = *piVar6;
                }
                else if (local_624 == 5) {
                  local_62c = *piVar6;
                }
                else {
                  local_62c = *piVar6;
                }
                if (0 < local_62c) {
                  local_865 = 1;
                  local_87c = 2;
                  goto LAB_004749df;
                }
              }
              else {
                if (local_934 == 0x14d) {
                  CLI::std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
                            ((basic_string_view<char,_std::char_traits<char>_> *)
                             CONCAT44(in_stack_ffffffffffffe5b4,in_stack_ffffffffffffe5b0),
                             (char *)CONCAT44(in_stack_ffffffffffffe5ac,in_stack_ffffffffffffe5a8));
                  message_03._M_str = in_stack_ffffffffffffe620;
                  message_03._M_len = (size_t)in_stack_ffffffffffffe618;
                  CommsInterface::logMessage
                            ((CommsInterface *)
                             CONCAT44(in_stack_ffffffffffffe614,in_stack_ffffffffffffe610),
                             message_03);
                  ActionMessage::getString_abi_cxx11_
                            ((ActionMessage *)
                             CONCAT44(in_stack_ffffffffffffe5ac,in_stack_ffffffffffffe5a8),
                             (int)((ulong)in_stack_ffffffffffffe5a0 >> 0x20));
                  gmlc::networking::extractInterfaceAndPort
                            ((string *)
                             CONCAT44(in_stack_ffffffffffffe6ac,in_stack_ffffffffffffe6a8.family_));
                  *(undefined4 *)(in_RDI + 0x410) = local_c50;
                  bVar1 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                           *)in_stack_ffffffffffffe5a0,
                                          (char *)CONCAT17(in_stack_ffffffffffffe59f,
                                                           in_stack_ffffffffffffe598));
                  in_stack_ffffffffffffe6ac = CONCAT13(bVar1,(int3)in_stack_ffffffffffffe6ac);
                  if (((bVar1 ^ 0xffU) & 1) != 0) {
                    CLI::std::__cxx11::
                    basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::operator=
                              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                               in_stack_ffffffffffffe5a0,
                               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                               CONCAT17(in_stack_ffffffffffffe59f,in_stack_ffffffffffffe598));
                  }
                  in_stack_ffffffffffffe6a8 = udpnet(LOCAL);
                  local_ce4 = in_stack_ffffffffffffe6a8.family_;
                  CLI::std::__cxx11::to_string((int)((ulong)in_stack_ffffffffffffe5d8 >> 0x20));
                  asio::ip::basic_resolver_query<asio::ip::udp>::basic_resolver_query
                            ((basic_resolver_query<asio::ip::udp> *)
                             CONCAT44(in_stack_ffffffffffffe5d4,in_stack_ffffffffffffe5d0),
                             (protocol_type *)in_stack_ffffffffffffe5c8,
                             (string *)CONCAT17(in_stack_ffffffffffffe5c7,in_stack_ffffffffffffe5c0)
                             ,(string *)
                              CONCAT44(in_stack_ffffffffffffe5bc,in_stack_ffffffffffffe5b8),
                             in_stack_ffffffffffffe5b4);
                  std::__cxx11::string::~string
                            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                             in_stack_ffffffffffffe5a0);
                  asio::ip::basic_resolver<asio::ip::udp,_asio::any_io_executor>::resolve
                            ((basic_resolver<asio::ip::udp,_asio::any_io_executor> *)
                             in_stack_ffffffffffffe5e8._M_node,
                             (query *)CONCAT44(in_stack_ffffffffffffe5e4,in_stack_ffffffffffffe5e0))
                  ;
                  asio::ip::basic_resolver_iterator<asio::ip::udp>::operator*
                            ((basic_resolver_iterator<asio::ip::udp> *)0x474816);
                  asio::ip::basic_resolver_entry::operator_cast_to_basic_endpoint
                            ((basic_resolver_entry<asio::ip::udp> *)
                             CONCAT17(in_stack_ffffffffffffe59f,in_stack_ffffffffffffe598));
                  asio::ip::basic_endpoint<asio::ip::udp>::operator=
                            ((basic_endpoint<asio::ip::udp> *)in_stack_ffffffffffffe5a0,
                             (basic_endpoint<asio::ip::udp> *)
                             CONCAT17(in_stack_ffffffffffffe59f,in_stack_ffffffffffffe598));
                  asio::ip::basic_resolver_results<asio::ip::udp>::~basic_resolver_results
                            ((basic_resolver_results<asio::ip::udp> *)0x474859);
                  local_87c = 2;
                  asio::ip::basic_resolver_query<asio::ip::udp>::~basic_resolver_query
                            ((basic_resolver_query<asio::ip::udp> *)in_stack_ffffffffffffe5a0);
                  std::
                  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>
                  ::~pair((pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>
                           *)0x47487e);
                  goto LAB_004749df;
                }
                if (local_934 == 0xed3) {
                  local_d4c = 2;
                  std::chrono::duration<long,std::ratio<1l,1l>>::duration<int,void>
                            (local_d48,&local_d4c);
                  std::this_thread::sleep_for<long,std::ratio<1l,1l>>
                            ((duration<long,_std::ratio<1L,_1L>_> *)
                             CONCAT44(in_stack_ffffffffffffe5e4,in_stack_ffffffffffffe5e0));
                }
                else if (local_934 == 0x9db) {
                  _Var3 = std::__atomic_base::operator_cast_to_int
                                    ((__atomic_base<int> *)
                                     CONCAT44(in_stack_ffffffffffffe5ac,in_stack_ffffffffffffe5a8));
                  if (_Var3 < 1) {
                    std::__atomic_base<int>::operator=
                              ((__atomic_base<int> *)
                               CONCAT44(in_stack_ffffffffffffe5ac,in_stack_ffffffffffffe5a8),
                               (__int_type)((ulong)in_stack_ffffffffffffe5a0 >> 0x20));
                    local_d50 = 0xffffffff;
                    std::promise<int>::set_value
                              (in_stack_ffffffffffffe5f0,(int *)in_stack_ffffffffffffe5e8._M_node);
                  }
                  CommsInterface::setTxStatus
                            ((CommsInterface *)
                             CONCAT44(in_stack_ffffffffffffe5b4,in_stack_ffffffffffffe5b0),
                             in_stack_ffffffffffffe5ac);
                  local_87c = 1;
                  goto LAB_004749df;
                }
              }
            }
            local_87c = 0;
            goto LAB_004749df;
          }
          local_a40 = std::chrono::_V2::steady_clock::now();
          local_a38 = (rep)std::chrono::operator-
                                     ((time_point<std::chrono::_V2::steady_clock,_std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_>
                                       *)CONCAT44(in_stack_ffffffffffffe5ac,
                                                  in_stack_ffffffffffffe5a8),
                                      (time_point<std::chrono::_V2::steady_clock,_std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_>
                                       *)in_stack_ffffffffffffe5a0);
          local_a29 = (type)std::chrono::
                            operator<=><long,_std::ratio<1L,_1000000000L>,_long,_std::ratio<1L,_1000L>_>
                                      ((duration<long,_std::ratio<1L,_1000000000L>_> *)
                                       in_stack_ffffffffffffe5c8,
                                       (duration<long,_std::ratio<1L,_1000L>_> *)
                                       CONCAT17(in_stack_ffffffffffffe5c7,in_stack_ffffffffffffe5c0)
                                      );
          CLI::std::__cmp_cat::__unspec::__unspec(&local_a41,(__unspec *)0x0);
          bVar1 = std::operator>(local_a29);
          if (bVar1) {
            local_9ed = 1;
          }
          bVar1 = std::atomic<bool>::load
                            ((atomic<bool> *)
                             CONCAT44(in_stack_ffffffffffffe5ac,in_stack_ffffffffffffe5a8),
                             (memory_order)((ulong)in_stack_ffffffffffffe5a0 >> 0x20));
          if (bVar1) break;
          local_a54 = 0x32;
          std::chrono::duration<long,std::ratio<1l,1000l>>::duration<int,void>(local_a50,&local_a54)
          ;
          std::this_thread::sleep_for<long,std::ratio<1l,1000l>>
                    ((duration<long,_std::ratio<1L,_1000L>_> *)
                     CONCAT44(in_stack_ffffffffffffe5e4,in_stack_ffffffffffffe5e0));
        }
        piVar6 = (int *)(in_RDI + 0x414);
        local_5dc = 5;
        local_5d8 = piVar6;
        local_5e0 = CLI::std::operator&(seq_cst,__memory_order_mask);
        if (local_5dc - 1U < 2) {
          local_5e4 = *piVar6;
        }
        else if (local_5dc == 5) {
          local_5e4 = *piVar6;
        }
        else {
          local_5e4 = *piVar6;
        }
        if (local_5e4 < 1) {
          std::__atomic_base<int>::operator=
                    ((__atomic_base<int> *)
                     CONCAT44(in_stack_ffffffffffffe5ac,in_stack_ffffffffffffe5a8),
                     (__int_type)((ulong)in_stack_ffffffffffffe5a0 >> 0x20));
          local_a48 = 0xffffffff;
          std::promise<int>::set_value
                    (in_stack_ffffffffffffe5f0,(int *)in_stack_ffffffffffffe5e8._M_node);
        }
        CommsInterface::setTxStatus
                  ((CommsInterface *)CONCAT44(in_stack_ffffffffffffe5b4,in_stack_ffffffffffffe5b0),
                   in_stack_ffffffffffffe5ac);
        local_87c = 1;
LAB_004749df:
        CLI::std::vector<char,_std::allocator<char>_>::~vector
                  ((vector<char,_std::allocator<char>_> *)
                   CONCAT44(in_stack_ffffffffffffe5b4,in_stack_ffffffffffffe5b0));
      }
      ActionMessage::~ActionMessage(in_stack_ffffffffffffe5a0);
    } while ((local_87c == 0) || (local_87c == 2));
    asio::ip::basic_resolver_query<asio::ip::udp>::~basic_resolver_query
              ((basic_resolver_query<asio::ip::udp> *)in_stack_ffffffffffffe5a0);
    if (local_87c != 0) goto LAB_004770bf;
  }
  else {
    _Var3 = std::__atomic_base::operator_cast_to_int
                      ((__atomic_base<int> *)
                       CONCAT44(in_stack_ffffffffffffe5ac,in_stack_ffffffffffffe5a8));
    if (_Var3 < 0) {
      getDefaultBrokerPort((UdpComms *)0x474ce0);
      std::__atomic_base<int>::operator=
                ((__atomic_base<int> *)CONCAT44(in_stack_ffffffffffffe5ac,in_stack_ffffffffffffe5a8)
                 ,(__int_type)((ulong)in_stack_ffffffffffffe5a0 >> 0x20));
      local_da8 = std::__atomic_base::operator_cast_to_int
                            ((__atomic_base<int> *)
                             CONCAT44(in_stack_ffffffffffffe5ac,in_stack_ffffffffffffe5a8));
      std::promise<int>::set_value
                (in_stack_ffffffffffffe5f0,(int *)in_stack_ffffffffffffe5e8._M_node);
    }
  }
  asio::ip::basic_endpoint<asio::ip::udp>::basic_endpoint((basic_endpoint<asio::ip::udp> *)0x474d5e)
  ;
  bVar1 = CLI::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
          empty((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x474d72);
  if (((bVar1) ||
      (bVar1 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                               in_stack_ffffffffffffe5a0,
                               (char *)CONCAT17(in_stack_ffffffffffffe59f,in_stack_ffffffffffffe598)
                              ), bVar1)) ||
     (bVar1 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                              in_stack_ffffffffffffe5a0,
                              (char *)CONCAT17(in_stack_ffffffffffffe59f,in_stack_ffffffffffffe598))
     , bVar1)) {
    local_e3c = (int)udpnet(LOCAL);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               CONCAT44(in_stack_ffffffffffffe5e4,in_stack_ffffffffffffe5e0),
               (char *)in_stack_ffffffffffffe5d8,
               (allocator<char> *)CONCAT44(in_stack_ffffffffffffe5d4,in_stack_ffffffffffffe5d0));
    std::__atomic_base::operator_cast_to_int
              ((__atomic_base<int> *)CONCAT44(in_stack_ffffffffffffe5ac,in_stack_ffffffffffffe5a8));
    CLI::std::__cxx11::to_string((int)((ulong)in_stack_ffffffffffffe5d8 >> 0x20));
    asio::ip::basic_resolver_query<asio::ip::udp>::basic_resolver_query
              ((basic_resolver_query<asio::ip::udp> *)
               CONCAT44(in_stack_ffffffffffffe5d4,in_stack_ffffffffffffe5d0),
               (protocol_type *)in_stack_ffffffffffffe5c8,
               (string *)CONCAT17(in_stack_ffffffffffffe5c7,in_stack_ffffffffffffe5c0),
               (string *)CONCAT44(in_stack_ffffffffffffe5bc,in_stack_ffffffffffffe5b8),
               in_stack_ffffffffffffe5b4);
    std::__cxx11::string::~string
              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               in_stack_ffffffffffffe5a0);
    std::__cxx11::string::~string
              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               in_stack_ffffffffffffe5a0);
    std::allocator<char>::~allocator(local_e61);
    asio::ip::basic_resolver<asio::ip::udp,_asio::any_io_executor>::resolve
              ((basic_resolver<asio::ip::udp,_asio::any_io_executor> *)
               in_stack_ffffffffffffe5e8._M_node,
               (query *)CONCAT44(in_stack_ffffffffffffe5e4,in_stack_ffffffffffffe5e0));
    asio::ip::basic_resolver_iterator<asio::ip::udp>::operator*
              ((basic_resolver_iterator<asio::ip::udp> *)0x474ede);
    asio::ip::basic_resolver_entry::operator_cast_to_basic_endpoint
              ((basic_resolver_entry<asio::ip::udp> *)
               CONCAT17(in_stack_ffffffffffffe59f,in_stack_ffffffffffffe598));
    asio::ip::basic_endpoint<asio::ip::udp>::operator=
              ((basic_endpoint<asio::ip::udp> *)in_stack_ffffffffffffe5a0,
               (basic_endpoint<asio::ip::udp> *)
               CONCAT17(in_stack_ffffffffffffe59f,in_stack_ffffffffffffe598));
    asio::ip::basic_resolver_results<asio::ip::udp>::~basic_resolver_results
              ((basic_resolver_results<asio::ip::udp> *)0x474f21);
    asio::ip::basic_resolver_query<asio::ip::udp>::~basic_resolver_query
              ((basic_resolver_query<asio::ip::udp> *)in_stack_ffffffffffffe5a0);
  }
  else {
    local_f34 = (int)udpnet(LOCAL);
    std::__atomic_base::operator_cast_to_int
              ((__atomic_base<int> *)CONCAT44(in_stack_ffffffffffffe5ac,in_stack_ffffffffffffe5a8));
    CLI::std::__cxx11::to_string((int)((ulong)in_stack_ffffffffffffe5d8 >> 0x20));
    asio::ip::basic_resolver_query<asio::ip::udp>::basic_resolver_query
              ((basic_resolver_query<asio::ip::udp> *)
               CONCAT44(in_stack_ffffffffffffe5d4,in_stack_ffffffffffffe5d0),
               (protocol_type *)in_stack_ffffffffffffe5c8,
               (string *)CONCAT17(in_stack_ffffffffffffe5c7,in_stack_ffffffffffffe5c0),
               (string *)CONCAT44(in_stack_ffffffffffffe5bc,in_stack_ffffffffffffe5b8),
               in_stack_ffffffffffffe5b4);
    std::__cxx11::string::~string
              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               in_stack_ffffffffffffe5a0);
    asio::ip::basic_resolver<asio::ip::udp,_asio::any_io_executor>::resolve
              ((basic_resolver<asio::ip::udp,_asio::any_io_executor> *)in_stack_ffffffffffffe5c8,
               (query *)CONCAT17(in_stack_ffffffffffffe5c7,in_stack_ffffffffffffe5c0),
               (error_code *)CONCAT44(in_stack_ffffffffffffe5bc,in_stack_ffffffffffffe5b8));
    bVar1 = std::error_code::operator_cast_to_bool(&local_740);
    if (bVar1) {
      local_fb0 = "Unable to resolve: {}";
      local_fa8 = 0x15;
      local_198 = in_RDI + 0xf0;
      local_180 = local_fa0;
      local_190 = "Unable to resolve: {}";
      uStack_188 = 0x15;
      local_1a8 = "Unable to resolve: {}";
      uStack_1a0 = 0x15;
      ::fmt::v11::detail::value<fmt::v11::context>::
      value<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_char,_0>
                ((value<fmt::v11::context> *)
                 CONCAT44(in_stack_ffffffffffffe5b4,in_stack_ffffffffffffe5b0),
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 CONCAT44(in_stack_ffffffffffffe5ac,in_stack_ffffffffffffe5a8));
      local_e8 = &local_1b8;
      local_f0 = local_1c8;
      local_1b8 = 0xd;
      fmt_02.size_ = in_stack_ffffffffffffe818;
      fmt_02.data_ = in_stack_ffffffffffffe810;
      args_02.field_1.values_ = in_stack_ffffffffffffe808.values_;
      args_02.desc_ = in_stack_ffffffffffffe800;
      local_1b0 = local_f0;
      ::fmt::v11::vformat_abi_cxx11_(fmt_02,args_02);
      local_f80 = std::__cxx11::string::operator_cast_to_basic_string_view
                            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                             in_stack_ffffffffffffe5a0);
      message_04._M_str = in_stack_ffffffffffffe620;
      message_04._M_len = (size_t)in_stack_ffffffffffffe618;
      CommsInterface::logError
                ((CommsInterface *)CONCAT44(in_stack_ffffffffffffe614,in_stack_ffffffffffffe610),
                 message_04);
      std::__cxx11::string::~string
                ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 in_stack_ffffffffffffe5a0);
      CommsInterface::setTxStatus
                ((CommsInterface *)CONCAT44(in_stack_ffffffffffffe5b4,in_stack_ffffffffffffe5b0),
                 in_stack_ffffffffffffe5ac);
    }
    else {
      asio::ip::basic_resolver_iterator<asio::ip::udp>::operator*
                ((basic_resolver_iterator<asio::ip::udp> *)0x4752a9);
      asio::ip::basic_resolver_entry::operator_cast_to_basic_endpoint
                ((basic_resolver_entry<asio::ip::udp> *)
                 CONCAT17(in_stack_ffffffffffffe59f,in_stack_ffffffffffffe598));
      asio::ip::basic_endpoint<asio::ip::udp>::operator=
                ((basic_endpoint<asio::ip::udp> *)in_stack_ffffffffffffe5a0,
                 (basic_endpoint<asio::ip::udp> *)
                 CONCAT17(in_stack_ffffffffffffe59f,in_stack_ffffffffffffe598));
    }
    local_87c = (uint)bVar1;
    asio::ip::basic_resolver_results<asio::ip::udp>::~basic_resolver_results
              ((basic_resolver_results<asio::ip::udp> *)0x4752f7);
    asio::ip::basic_resolver_query<asio::ip::udp>::~basic_resolver_query
              ((basic_resolver_query<asio::ip::udp> *)in_stack_ffffffffffffe5a0);
    if (local_87c != 0) goto LAB_004770bf;
  }
  CommsInterface::setTxStatus
            ((CommsInterface *)CONCAT44(in_stack_ffffffffffffe5b4,in_stack_ffffffffffffe5b0),
             in_stack_ffffffffffffe5ac);
  local_fcd = 1;
  while ((local_fcd & 1) != 0) {
    route_id::route_id(&local_fd4);
    ActionMessage::ActionMessage
              ((ActionMessage *)CONCAT44(in_stack_ffffffffffffe5b4,in_stack_ffffffffffffe5b0));
    gmlc::containers::
    BlockingPriorityQueue<std::pair<helics::route_id,_helics::ActionMessage>,_std::mutex,_std::condition_variable>
    ::pop(this_00);
    std::tie<helics::route_id,helics::ActionMessage>
              ((route_id *)CONCAT44(in_stack_ffffffffffffe5ac,in_stack_ffffffffffffe5a8),
               in_stack_ffffffffffffe5a0);
    std::tuple<helics::route_id&,helics::ActionMessage&>::operator=
              ((tuple<helics::route_id_&,_helics::ActionMessage_&> *)
               CONCAT44(in_stack_ffffffffffffe5b4,in_stack_ffffffffffffe5b0),
               (pair<helics::route_id,_helics::ActionMessage> *)
               CONCAT44(in_stack_ffffffffffffe5ac,in_stack_ffffffffffffe5a8));
    std::pair<helics::route_id,_helics::ActionMessage>::~pair
              ((pair<helics::route_id,_helics::ActionMessage> *)0x4753d4);
    local_1161 = 0;
    bVar1 = isProtocolCommand(in_stack_ffffffffffffe5a0);
    if (bVar1) {
      local_1168 = 0xffffffff;
      bVar1 = route_id::operator==(&local_fd4,(route_id)0xffffffff);
      if (bVar1) {
        if (local_108c == 0xe9) {
          sVar8 = SmallBuffer::to_string((SmallBuffer *)0x475498);
          local_1198 = sVar8;
          std::allocator<char>::allocator();
          std::__cxx11::string::string<std::basic_string_view<char,std::char_traits<char>>,void>
                    ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     CONCAT44(in_stack_ffffffffffffe5e4,in_stack_ffffffffffffe5e0),
                     (basic_string_view<char,_std::char_traits<char>_> *)in_stack_ffffffffffffe5d8,
                     (allocator<char> *)
                     CONCAT44(in_stack_ffffffffffffe5d4,in_stack_ffffffffffffe5d0));
          std::allocator<char>::~allocator(&local_1199);
          std::__cxx11::string::string
                    ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     CONCAT44(in_stack_ffffffffffffe5b4,in_stack_ffffffffffffe5b0));
          std::__cxx11::string::string
                    ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     CONCAT44(in_stack_ffffffffffffe5b4,in_stack_ffffffffffffe5b0));
          gmlc::networking::extractInterfaceAndPortString((string *)in_stack_ffffffffffffe608);
          in_stack_ffffffffffffe618 = local_1230;
          std::tie<std::__cxx11::string,std::__cxx11::string>
                    ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     CONCAT44(in_stack_ffffffffffffe5ac,in_stack_ffffffffffffe5a8),
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     in_stack_ffffffffffffe5a0);
          in_stack_ffffffffffffe620 = local_1220;
          std::tuple<std::__cxx11::string&,std::__cxx11::string&>::operator=
                    ((tuple<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&>
                      *)CONCAT44(in_stack_ffffffffffffe5b4,in_stack_ffffffffffffe5b0),
                     (pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                      *)CONCAT44(in_stack_ffffffffffffe5ac,in_stack_ffffffffffffe5a8));
          CLI::std::
          pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
          ::~pair((pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                   *)in_stack_ffffffffffffe5a0);
          local_12a4 = (int)udpnet(LOCAL);
          asio::ip::basic_resolver_query<asio::ip::udp>::basic_resolver_query
                    ((basic_resolver_query<asio::ip::udp> *)
                     CONCAT44(in_stack_ffffffffffffe5d4,in_stack_ffffffffffffe5d0),
                     (protocol_type *)in_stack_ffffffffffffe5c8,
                     (string *)CONCAT17(in_stack_ffffffffffffe5c7,in_stack_ffffffffffffe5c0),
                     (string *)CONCAT44(in_stack_ffffffffffffe5bc,in_stack_ffffffffffffe5b8),
                     in_stack_ffffffffffffe5b4);
          in_stack_ffffffffffffe614 = ActionMessage::getExtraData((ActionMessage *)0x4755f0);
          route_id::route_id(&local_12a8,in_stack_ffffffffffffe614);
          asio::ip::basic_resolver<asio::ip::udp,_asio::any_io_executor>::resolve
                    ((basic_resolver<asio::ip::udp,_asio::any_io_executor> *)
                     in_stack_ffffffffffffe5e8._M_node,
                     (query *)CONCAT44(in_stack_ffffffffffffe5e4,in_stack_ffffffffffffe5e0));
          in_stack_ffffffffffffe608 =
               asio::ip::basic_resolver_iterator<asio::ip::udp>::operator*
                         ((basic_resolver_iterator<asio::ip::udp> *)0x475633);
          pVar9 = std::
                  map<helics::route_id,asio::ip::basic_endpoint<asio::ip::udp>,std::less<helics::route_id>,std::allocator<std::pair<helics::route_id_const,asio::ip::basic_endpoint<asio::ip::udp>>>>
                  ::emplace<helics::route_id,asio::ip::basic_resolver_entry<asio::ip::udp>const&>
                            ((map<helics::route_id,_asio::ip::basic_endpoint<asio::ip::udp>,_std::less<helics::route_id>,_std::allocator<std::pair<const_helics::route_id,_asio::ip::basic_endpoint<asio::ip::udp>_>_>_>
                              *)CONCAT44(in_stack_ffffffffffffe5b4,in_stack_ffffffffffffe5b0),
                             (route_id *)
                             CONCAT44(in_stack_ffffffffffffe5ac,in_stack_ffffffffffffe5a8),
                             (basic_resolver_entry<asio::ip::udp> *)in_stack_ffffffffffffe5a0);
          local_12d0 = (_Base_ptr)pVar9.first._M_node;
          local_12c8 = pVar9.second;
          in_stack_ffffffffffffe5fc = CONCAT13(local_12c8,(int3)in_stack_ffffffffffffe5fc);
          asio::ip::basic_resolver_results<asio::ip::udp>::~basic_resolver_results
                    ((basic_resolver_results<asio::ip::udp> *)0x475684);
          asio::ip::basic_resolver_query<asio::ip::udp>::~basic_resolver_query
                    ((basic_resolver_query<asio::ip::udp> *)in_stack_ffffffffffffe5a0);
          std::__cxx11::string::~string
                    ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     in_stack_ffffffffffffe5a0);
          std::__cxx11::string::~string
                    ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     in_stack_ffffffffffffe5a0);
          std::__cxx11::string::~string
                    ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     in_stack_ffffffffffffe5a0);
          local_1161 = 1;
        }
        else if (local_108c == 0xf4) {
          in_stack_ffffffffffffe5f8 = ActionMessage::getExtraData((ActionMessage *)0x47596b);
          route_id::route_id(local_1324,in_stack_ffffffffffffe5f8);
          std::
          map<helics::route_id,_asio::ip::basic_endpoint<asio::ip::udp>,_std::less<helics::route_id>,_std::allocator<std::pair<const_helics::route_id,_asio::ip::basic_endpoint<asio::ip::udp>_>_>_>
          ::erase((map<helics::route_id,_asio::ip::basic_endpoint<asio::ip::udp>,_std::less<helics::route_id>,_std::allocator<std::pair<const_helics::route_id,_asio::ip::basic_endpoint<asio::ip::udp>_>_>_>
                   *)in_stack_ffffffffffffe5a0,
                  (key_type *)CONCAT17(in_stack_ffffffffffffe59f,in_stack_ffffffffffffe598));
          local_1161 = 1;
        }
        else if (local_108c == 0x9db) {
          local_fcd = 0;
          local_1161 = 1;
        }
        else if (local_108c == 0x16570bf) {
          ActionMessage::to_string_abi_cxx11_
                    ((ActionMessage *)CONCAT44(in_stack_ffffffffffffe5fc,in_stack_ffffffffffffe5f8))
          ;
          local_1338 = (const_buffer)
                       asio::buffer<char,std::char_traits<char>,std::allocator<char>>
                                 ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                   *)in_stack_ffffffffffffe5a0);
          asio::basic_datagram_socket<asio::ip::udp,_asio::any_io_executor>::
          send_to<asio::const_buffers_1>
                    ((basic_datagram_socket<asio::ip::udp,_asio::any_io_executor> *)
                     CONCAT17(in_stack_ffffffffffffe5c7,in_stack_ffffffffffffe5c0),
                     (const_buffers_1 *)
                     CONCAT44(in_stack_ffffffffffffe5bc,in_stack_ffffffffffffe5b8),
                     (endpoint_type *)CONCAT44(in_stack_ffffffffffffe5b4,in_stack_ffffffffffffe5b0),
                     in_stack_ffffffffffffe5ac,(error_code *)in_stack_ffffffffffffe5a0);
          std::__cxx11::string::~string
                    ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     in_stack_ffffffffffffe5a0);
          bVar1 = std::error_code::operator_cast_to_bool(&local_740);
          if (bVar1) {
            local_1398 = "transmit failure on sending \'close\' to receiver  {}";
            local_1390 = 0x33;
            std::error_code::message_abi_cxx11_
                      ((error_code *)CONCAT44(in_stack_ffffffffffffe5bc,in_stack_ffffffffffffe5b8));
            local_360 = local_1388;
            local_370 = local_1398;
            uStack_368 = local_1390;
            local_378 = local_13b8;
            local_388 = local_1398;
            uStack_380 = local_1390;
            ::fmt::v11::detail::value<fmt::v11::context>::
            value<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_char,_0>
                      ((value<fmt::v11::context> *)
                       CONCAT44(in_stack_ffffffffffffe5b4,in_stack_ffffffffffffe5b0),
                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       CONCAT44(in_stack_ffffffffffffe5ac,in_stack_ffffffffffffe5a8));
            local_a8 = &local_398;
            local_b0 = local_3a8;
            local_398 = 0xd;
            fmt_03.size_ = in_stack_ffffffffffffe818;
            fmt_03.data_ = in_stack_ffffffffffffe810;
            args_03.field_1.values_ = in_stack_ffffffffffffe808.values_;
            args_03.desc_ = in_stack_ffffffffffffe800;
            local_390 = local_b0;
            ::fmt::v11::vformat_abi_cxx11_(fmt_03,args_03);
            local_1368 = std::__cxx11::string::operator_cast_to_basic_string_view
                                   ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                     *)in_stack_ffffffffffffe5a0);
            message_05._M_str = in_stack_ffffffffffffe620;
            message_05._M_len = (size_t)in_stack_ffffffffffffe618;
            CommsInterface::logError
                      ((CommsInterface *)
                       CONCAT44(in_stack_ffffffffffffe614,in_stack_ffffffffffffe610),message_05);
            std::__cxx11::string::~string
                      ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       in_stack_ffffffffffffe5a0);
            std::__cxx11::string::~string
                      ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       in_stack_ffffffffffffe5a0);
          }
          local_6c9 = 1;
          local_1161 = 1;
        }
      }
    }
    if ((local_1161 & 1) == 0) {
      local_13bc = 0;
      bVar1 = route_id::operator==(&local_fd4,(route_id)0x0);
      if (bVar1) {
        bVar1 = std::atomic::operator_cast_to_bool
                          ((atomic<bool> *)
                           CONCAT44(in_stack_ffffffffffffe5ac,in_stack_ffffffffffffe5a8));
        if (bVar1) {
          ActionMessage::to_string_abi_cxx11_
                    ((ActionMessage *)CONCAT44(in_stack_ffffffffffffe5fc,in_stack_ffffffffffffe5f8))
          ;
          local_13d0 = (const_buffer)
                       asio::buffer<char,std::char_traits<char>,std::allocator<char>>
                                 ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                   *)in_stack_ffffffffffffe5a0);
          asio::basic_datagram_socket<asio::ip::udp,_asio::any_io_executor>::
          send_to<asio::const_buffers_1>
                    ((basic_datagram_socket<asio::ip::udp,_asio::any_io_executor> *)
                     CONCAT17(in_stack_ffffffffffffe5c7,in_stack_ffffffffffffe5c0),
                     (const_buffers_1 *)
                     CONCAT44(in_stack_ffffffffffffe5bc,in_stack_ffffffffffffe5b8),
                     (endpoint_type *)CONCAT44(in_stack_ffffffffffffe5b4,in_stack_ffffffffffffe5b0),
                     in_stack_ffffffffffffe5ac,(error_code *)in_stack_ffffffffffffe5a0);
          std::__cxx11::string::~string
                    ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     in_stack_ffffffffffffe5a0);
          bVar1 = std::error_code::operator_cast_to_bool(&local_740);
          if (bVar1) {
            local_1430 = "transmit failure sending to broker  {}";
            local_1428 = 0x26;
            std::error_code::message_abi_cxx11_
                      ((error_code *)CONCAT44(in_stack_ffffffffffffe5bc,in_stack_ffffffffffffe5b8));
            local_3b0 = local_1420;
            local_3c0 = local_1430;
            uStack_3b8 = local_1428;
            local_3c8 = local_1450;
            local_3d8 = local_1430;
            uStack_3d0 = local_1428;
            ::fmt::v11::detail::value<fmt::v11::context>::
            value<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_char,_0>
                      ((value<fmt::v11::context> *)
                       CONCAT44(in_stack_ffffffffffffe5b4,in_stack_ffffffffffffe5b0),
                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       CONCAT44(in_stack_ffffffffffffe5ac,in_stack_ffffffffffffe5a8));
            local_98 = &local_3e8;
            local_a0 = local_3f8;
            local_3e8 = 0xd;
            fmt_04.size_ = in_stack_ffffffffffffe818;
            fmt_04.data_ = in_stack_ffffffffffffe810;
            args_04.field_1.values_ = in_stack_ffffffffffffe808.values_;
            args_04.desc_ = in_stack_ffffffffffffe800;
            local_3e0 = local_a0;
            ::fmt::v11::vformat_abi_cxx11_(fmt_04,args_04);
            local_1400 = std::__cxx11::string::operator_cast_to_basic_string_view
                                   ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                     *)in_stack_ffffffffffffe5a0);
            message_06._M_str = in_stack_ffffffffffffe620;
            message_06._M_len = (size_t)in_stack_ffffffffffffe618;
            CommsInterface::logWarning
                      ((CommsInterface *)
                       CONCAT44(in_stack_ffffffffffffe614,in_stack_ffffffffffffe610),message_06);
            std::__cxx11::string::~string
                      ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       in_stack_ffffffffffffe5a0);
            std::__cxx11::string::~string
                      ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       in_stack_ffffffffffffe5a0);
          }
        }
        else {
          local_1490 = 
          "message directed to broker of comm system with no broker, message dropped {}";
          local_1488 = 0x4c;
          prettyPrintString_abi_cxx11_(in_stack_ffffffffffffe860);
          local_400 = local_1480;
          local_410 = local_1490;
          uStack_408 = local_1488;
          local_418 = local_14b0;
          local_428 = local_1490;
          uStack_420 = local_1488;
          ::fmt::v11::detail::value<fmt::v11::context>::
          value<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_char,_0>
                    ((value<fmt::v11::context> *)
                     CONCAT44(in_stack_ffffffffffffe5b4,in_stack_ffffffffffffe5b0),
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     CONCAT44(in_stack_ffffffffffffe5ac,in_stack_ffffffffffffe5a8));
          local_88 = &local_438;
          local_90 = local_448;
          local_438 = 0xd;
          fmt_05.size_ = in_stack_ffffffffffffe818;
          fmt_05.data_ = in_stack_ffffffffffffe810;
          args_05.field_1.values_ = in_stack_ffffffffffffe808.values_;
          args_05.desc_ = in_stack_ffffffffffffe800;
          local_430 = local_90;
          ::fmt::v11::vformat_abi_cxx11_(fmt_05,args_05);
          local_1460 = std::__cxx11::string::operator_cast_to_basic_string_view
                                 ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                   *)in_stack_ffffffffffffe5a0);
          message_07._M_str = in_stack_ffffffffffffe620;
          message_07._M_len = (size_t)in_stack_ffffffffffffe618;
          CommsInterface::logWarning
                    ((CommsInterface *)CONCAT44(in_stack_ffffffffffffe614,in_stack_ffffffffffffe610)
                     ,message_07);
          std::__cxx11::string::~string
                    ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     in_stack_ffffffffffffe5a0);
          std::__cxx11::string::~string
                    ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     in_stack_ffffffffffffe5a0);
        }
      }
      else {
        local_14b4 = 0xffffffff;
        bVar1 = route_id::operator==(&local_fd4,(route_id)0xffffffff);
        if (bVar1) {
          ActionMessage::to_string_abi_cxx11_
                    ((ActionMessage *)CONCAT44(in_stack_ffffffffffffe5fc,in_stack_ffffffffffffe5f8))
          ;
          local_14c8 = (const_buffer)
                       asio::buffer<char,std::char_traits<char>,std::allocator<char>>
                                 ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                   *)in_stack_ffffffffffffe5a0);
          asio::basic_datagram_socket<asio::ip::udp,_asio::any_io_executor>::
          send_to<asio::const_buffers_1>
                    ((basic_datagram_socket<asio::ip::udp,_asio::any_io_executor> *)
                     CONCAT17(in_stack_ffffffffffffe5c7,in_stack_ffffffffffffe5c0),
                     (const_buffers_1 *)
                     CONCAT44(in_stack_ffffffffffffe5bc,in_stack_ffffffffffffe5b8),
                     (endpoint_type *)CONCAT44(in_stack_ffffffffffffe5b4,in_stack_ffffffffffffe5b0),
                     in_stack_ffffffffffffe5ac,(error_code *)in_stack_ffffffffffffe5a0);
          std::__cxx11::string::~string
                    ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     in_stack_ffffffffffffe5a0);
          bVar1 = std::error_code::operator_cast_to_bool(&local_740);
          if (bVar1) {
            local_1528 = "transmit failure sending control message to receiver  {}";
            local_1520 = 0x38;
            std::error_code::message_abi_cxx11_
                      ((error_code *)CONCAT44(in_stack_ffffffffffffe5bc,in_stack_ffffffffffffe5b8));
            local_450 = local_1518;
            local_460 = local_1528;
            uStack_458 = local_1520;
            local_468 = local_1548;
            local_478 = local_1528;
            uStack_470 = local_1520;
            ::fmt::v11::detail::value<fmt::v11::context>::
            value<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_char,_0>
                      ((value<fmt::v11::context> *)
                       CONCAT44(in_stack_ffffffffffffe5b4,in_stack_ffffffffffffe5b0),
                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       CONCAT44(in_stack_ffffffffffffe5ac,in_stack_ffffffffffffe5a8));
            local_78 = &local_488;
            local_80 = local_498;
            local_488 = 0xd;
            fmt_06.size_ = in_stack_ffffffffffffe818;
            fmt_06.data_ = in_stack_ffffffffffffe810;
            args_06.field_1.values_ = in_stack_ffffffffffffe808.values_;
            args_06.desc_ = in_stack_ffffffffffffe800;
            local_480 = local_80;
            ::fmt::v11::vformat_abi_cxx11_(fmt_06,args_06);
            local_14f8 = std::__cxx11::string::operator_cast_to_basic_string_view
                                   ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                     *)in_stack_ffffffffffffe5a0);
            message_08._M_str = in_stack_ffffffffffffe620;
            message_08._M_len = (size_t)in_stack_ffffffffffffe618;
            CommsInterface::logWarning
                      ((CommsInterface *)
                       CONCAT44(in_stack_ffffffffffffe614,in_stack_ffffffffffffe610),message_08);
            std::__cxx11::string::~string
                      ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       in_stack_ffffffffffffe5a0);
            std::__cxx11::string::~string
                      ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       in_stack_ffffffffffffe5a0);
          }
        }
        else {
          in_stack_ffffffffffffe5e8 =
               std::
               map<helics::route_id,_asio::ip::basic_endpoint<asio::ip::udp>,_std::less<helics::route_id>,_std::allocator<std::pair<const_helics::route_id,_asio::ip::basic_endpoint<asio::ip::udp>_>_>_>
               ::find((map<helics::route_id,_asio::ip::basic_endpoint<asio::ip::udp>,_std::less<helics::route_id>,_std::allocator<std::pair<const_helics::route_id,_asio::ip::basic_endpoint<asio::ip::udp>_>_>_>
                       *)CONCAT17(in_stack_ffffffffffffe59f,in_stack_ffffffffffffe598),
                      (key_type *)0x47630b);
          local_1550._M_node = in_stack_ffffffffffffe5e8._M_node;
          local_1558._M_node =
               (_Base_ptr)
               std::
               map<helics::route_id,_asio::ip::basic_endpoint<asio::ip::udp>,_std::less<helics::route_id>,_std::allocator<std::pair<const_helics::route_id,_asio::ip::basic_endpoint<asio::ip::udp>_>_>_>
               ::end((map<helics::route_id,_asio::ip::basic_endpoint<asio::ip::udp>,_std::less<helics::route_id>,_std::allocator<std::pair<const_helics::route_id,_asio::ip::basic_endpoint<asio::ip::udp>_>_>_>
                      *)CONCAT17(in_stack_ffffffffffffe59f,in_stack_ffffffffffffe598));
          bVar1 = std::operator==(&local_1550,&local_1558);
          if (((bVar1 ^ 0xffU) & 1) == 0) {
            bVar1 = std::atomic::operator_cast_to_bool
                              ((atomic<bool> *)
                               CONCAT44(in_stack_ffffffffffffe5ac,in_stack_ffffffffffffe5a8));
            if (bVar1) {
              ActionMessage::to_string_abi_cxx11_
                        ((ActionMessage *)
                         CONCAT44(in_stack_ffffffffffffe5fc,in_stack_ffffffffffffe5f8));
              local_1600 = (const_buffer)
                           asio::buffer<char,std::char_traits<char>,std::allocator<char>>
                                     ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                       *)in_stack_ffffffffffffe5a0);
              asio::basic_datagram_socket<asio::ip::udp,_asio::any_io_executor>::
              send_to<asio::const_buffers_1>
                        ((basic_datagram_socket<asio::ip::udp,_asio::any_io_executor> *)
                         CONCAT17(in_stack_ffffffffffffe5c7,in_stack_ffffffffffffe5c0),
                         (const_buffers_1 *)
                         CONCAT44(in_stack_ffffffffffffe5bc,in_stack_ffffffffffffe5b8),
                         (endpoint_type *)
                         CONCAT44(in_stack_ffffffffffffe5b4,in_stack_ffffffffffffe5b0),
                         in_stack_ffffffffffffe5ac,(error_code *)in_stack_ffffffffffffe5a0);
              std::__cxx11::string::~string
                        ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         in_stack_ffffffffffffe5a0);
              bVar1 = std::error_code::operator_cast_to_bool(&local_740);
              if (bVar1) {
                local_16d1._113_8_ = "transmit failure sending to broker  {}";
                local_1658 = 0x26;
                std::error_code::message_abi_cxx11_
                          ((error_code *)
                           CONCAT44(in_stack_ffffffffffffe5bc,in_stack_ffffffffffffe5b8));
                local_4a0 = local_1650;
                local_4b0 = (char *)local_16d1._113_8_;
                uStack_4a8 = local_1658;
                local_4b8 = local_16d1 + 0x51;
                local_4c8 = (char *)local_16d1._113_8_;
                uStack_4c0 = local_1658;
                ::fmt::v11::detail::value<fmt::v11::context>::
                value<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_char,_0>
                          ((value<fmt::v11::context> *)
                           CONCAT44(in_stack_ffffffffffffe5b4,in_stack_ffffffffffffe5b0),
                           (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                           CONCAT44(in_stack_ffffffffffffe5ac,in_stack_ffffffffffffe5a8));
                local_68 = &local_4d8;
                local_70 = local_4e8;
                local_4d8 = 0xd;
                fmt_08.size_ = in_stack_ffffffffffffe818;
                fmt_08.data_ = in_stack_ffffffffffffe810;
                args_08.field_1.values_ = in_stack_ffffffffffffe808.values_;
                args_08.desc_ = in_stack_ffffffffffffe800;
                local_4d0 = local_70;
                ::fmt::v11::vformat_abi_cxx11_(fmt_08,args_08);
                local_1630 = std::__cxx11::string::operator_cast_to_basic_string_view
                                       ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                         *)in_stack_ffffffffffffe5a0);
                message_10._M_str = in_stack_ffffffffffffe620;
                message_10._M_len = (size_t)in_stack_ffffffffffffe618;
                CommsInterface::logWarning
                          ((CommsInterface *)
                           CONCAT44(in_stack_ffffffffffffe614,in_stack_ffffffffffffe610),message_10)
                ;
                std::__cxx11::string::~string
                          ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                           in_stack_ffffffffffffe5a0);
                std::__cxx11::string::~string
                          ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                           in_stack_ffffffffffffe5a0);
              }
            }
            else {
              bVar1 = isDisconnectCommand((ActionMessage *)
                                          CONCAT44(in_stack_ffffffffffffe5ac,
                                                   in_stack_ffffffffffffe5a8));
              if (!bVar1) {
                in_stack_ffffffffffffe5d8 = (TriggerVariable *)local_16d1;
                std::allocator<char>::allocator();
                std::__cxx11::string::string<std::allocator<char>>
                          ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                           CONCAT44(in_stack_ffffffffffffe5e4,in_stack_ffffffffffffe5e0),
                           (char *)in_stack_ffffffffffffe5d8,
                           (allocator<char> *)
                           CONCAT44(in_stack_ffffffffffffe5d4,in_stack_ffffffffffffe5d0));
                prettyPrintString_abi_cxx11_(in_stack_ffffffffffffe860);
                std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                               in_stack_ffffffffffffe5d8,
                               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                               CONCAT44(in_stack_ffffffffffffe5d4,in_stack_ffffffffffffe5d0));
                local_16d1._65_16_ =
                     (undefined1  [16])
                     std::__cxx11::string::operator_cast_to_basic_string_view
                               ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *
                                )in_stack_ffffffffffffe5a0);
                message_11._M_str = in_stack_ffffffffffffe620;
                message_11._M_len = (size_t)in_stack_ffffffffffffe618;
                CommsInterface::logWarning
                          ((CommsInterface *)
                           CONCAT44(in_stack_ffffffffffffe614,in_stack_ffffffffffffe610),message_11)
                ;
                std::__cxx11::string::~string
                          ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                           in_stack_ffffffffffffe5a0);
                std::__cxx11::string::~string
                          ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                           in_stack_ffffffffffffe5a0);
                std::__cxx11::string::~string
                          ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                           in_stack_ffffffffffffe5a0);
                std::allocator<char>::~allocator((allocator<char> *)local_16d1);
              }
            }
          }
          else {
            ActionMessage::to_string_abi_cxx11_
                      ((ActionMessage *)
                       CONCAT44(in_stack_ffffffffffffe5fc,in_stack_ffffffffffffe5f8));
            local_1568 = (const_buffer)
                         asio::buffer<char,std::char_traits<char>,std::allocator<char>>
                                   ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                     *)in_stack_ffffffffffffe5a0);
            std::
            _Rb_tree_iterator<std::pair<const_helics::route_id,_asio::ip::basic_endpoint<asio::ip::udp>_>_>
            ::operator->((_Rb_tree_iterator<std::pair<const_helics::route_id,_asio::ip::basic_endpoint<asio::ip::udp>_>_>
                          *)0x476395);
            asio::basic_datagram_socket<asio::ip::udp,_asio::any_io_executor>::
            send_to<asio::const_buffers_1>
                      ((basic_datagram_socket<asio::ip::udp,_asio::any_io_executor> *)
                       CONCAT17(in_stack_ffffffffffffe5c7,in_stack_ffffffffffffe5c0),
                       (const_buffers_1 *)
                       CONCAT44(in_stack_ffffffffffffe5bc,in_stack_ffffffffffffe5b8),
                       (endpoint_type *)
                       CONCAT44(in_stack_ffffffffffffe5b4,in_stack_ffffffffffffe5b0),
                       in_stack_ffffffffffffe5ac,(error_code *)in_stack_ffffffffffffe5a0);
            std::__cxx11::string::~string
                      ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       in_stack_ffffffffffffe5a0);
            bVar1 = std::error_code::operator_cast_to_bool(&local_740);
            if (bVar1) {
              local_15c8 = "transmit failure sending to route {}:{}";
              local_15c0 = 0x27;
              in_stack_ffffffffffffe5e4 = route_id::baseValue(&local_fd4);
              local_15cc = in_stack_ffffffffffffe5e4;
              std::error_code::message_abi_cxx11_
                        ((error_code *)CONCAT44(in_stack_ffffffffffffe5bc,in_stack_ffffffffffffe5b8)
                        );
              local_118 = local_15b8;
              local_128 = local_15c8;
              uStack_120 = local_15c0;
              local_130 = &local_15cc;
              local_138 = local_15f0;
              local_148 = local_15c8;
              uStack_140 = local_15c0;
              local_1c = local_15cc;
              local_18 = local_178;
              local_178[0] = local_15cc;
              ::fmt::v11::detail::value<fmt::v11::context>::
              value<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_char,_0>
                        ((value<fmt::v11::context> *)
                         CONCAT44(in_stack_ffffffffffffe5b4,in_stack_ffffffffffffe5b0),
                         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         CONCAT44(in_stack_ffffffffffffe5ac,in_stack_ffffffffffffe5a8));
              local_8 = &local_158;
              local_10 = local_178;
              local_158 = 0xd1;
              fmt_07.size_ = in_stack_ffffffffffffe818;
              fmt_07.data_ = in_stack_ffffffffffffe810;
              args_07.field_1.values_ = in_stack_ffffffffffffe808.values_;
              args_07.desc_ = in_stack_ffffffffffffe800;
              local_150 = local_10;
              ::fmt::v11::vformat_abi_cxx11_(fmt_07,args_07);
              local_1598 = std::__cxx11::string::operator_cast_to_basic_string_view
                                     ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                       *)in_stack_ffffffffffffe5a0);
              message_09._M_str = in_stack_ffffffffffffe620;
              message_09._M_len = (size_t)in_stack_ffffffffffffe618;
              CommsInterface::logWarning
                        ((CommsInterface *)
                         CONCAT44(in_stack_ffffffffffffe614,in_stack_ffffffffffffe610),message_09);
              std::__cxx11::string::~string
                        ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         in_stack_ffffffffffffe5a0);
              std::__cxx11::string::~string
                        ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         in_stack_ffffffffffffe5a0);
            }
          }
        }
      }
      local_87c = 0;
    }
    else {
      local_87c = 6;
    }
    ActionMessage::~ActionMessage(in_stack_ffffffffffffe5a0);
  }
  std::
  map<helics::route_id,_asio::ip::basic_endpoint<asio::ip::udp>,_std::less<helics::route_id>,_std::allocator<std::pair<const_helics::route_id,_asio::ip::basic_endpoint<asio::ip::udp>_>_>_>
  ::clear((map<helics::route_id,_asio::ip::basic_endpoint<asio::ip::udp>,_std::less<helics::route_id>,_std::allocator<std::pair<const_helics::route_id,_asio::ip::basic_endpoint<asio::ip::udp>_>_>_>
           *)0x476a4e);
  CVar5 = CommsInterface::getRxStatus((CommsInterface *)0x476a5b);
  this_01 = (CommsInterface *)CONCAT44(in_stack_ffffffffffffe5b4,in_stack_ffffffffffffe5b0);
  if (CVar5 == CONNECTED) {
    if ((local_6c9 & 1) == 0) {
      in_stack_ffffffffffffe5a0 = (ActionMessage *)&stack0xffffffffffffe81f;
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 CONCAT44(in_stack_ffffffffffffe5e4,in_stack_ffffffffffffe5e0),
                 (char *)in_stack_ffffffffffffe5d8,
                 (allocator<char> *)CONCAT44(CVar5,in_stack_ffffffffffffe5d0));
      std::allocator<char>::~allocator((allocator<char> *)&stack0xffffffffffffe81f);
      mVar10 = asio::buffer<char,std::char_traits<char>,std::allocator<char>>
                         ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                          in_stack_ffffffffffffe5a0);
      aVar12 = (anon_union_8_2_de49483c_for_basic_format_args<fmt::v11::context>_2)
               mVar10.super_mutable_buffer.data_;
      pcVar13 = (char *)mVar10.super_mutable_buffer.size_;
      asio::basic_datagram_socket<asio::ip::udp,_asio::any_io_executor>::
      send_to<asio::mutable_buffers_1>
                ((basic_datagram_socket<asio::ip::udp,_asio::any_io_executor> *)
                 CONCAT17(in_stack_ffffffffffffe5c7,in_stack_ffffffffffffe5c0),
                 (mutable_buffers_1 *)CONCAT44(in_stack_ffffffffffffe5bc,in_stack_ffffffffffffe5b8),
                 (endpoint_type *)CONCAT44(in_stack_ffffffffffffe5b4,in_stack_ffffffffffffe5b0),
                 in_stack_ffffffffffffe5ac,(error_code *)in_stack_ffffffffffffe5a0);
      bVar1 = std::error_code::operator_cast_to_bool(&local_740);
      if (bVar1) {
        local_1838 = "transmit failure sending close to receiver II:{}";
        local_1830 = 0x30;
        std::error_code::message_abi_cxx11_
                  ((error_code *)CONCAT44(in_stack_ffffffffffffe5bc,in_stack_ffffffffffffe5b8));
        local_540 = local_1828;
        local_550 = local_1838;
        uStack_548 = local_1830;
        local_558 = local_1858;
        local_568 = local_1838;
        uStack_560 = local_1830;
        ::fmt::v11::detail::value<fmt::v11::context>::
        value<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_char,_0>
                  ((value<fmt::v11::context> *)
                   CONCAT44(in_stack_ffffffffffffe5b4,in_stack_ffffffffffffe5b0),
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   CONCAT44(in_stack_ffffffffffffe5ac,in_stack_ffffffffffffe5a8));
        local_48 = &local_578;
        local_50 = local_588;
        local_578 = 0xd;
        fmt_10.size_ = in_stack_ffffffffffffe818;
        fmt_10.data_ = pcVar13;
        args_10.field_1.values_ = aVar12.values_;
        args_10.desc_ = in_stack_ffffffffffffe800;
        local_570 = local_50;
        ::fmt::v11::vformat_abi_cxx11_(fmt_10,args_10);
        _Var11 = std::__cxx11::string::operator_cast_to_basic_string_view
                           ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                            in_stack_ffffffffffffe5a0);
        local_1808 = _Var11._M_len;
        message_14._M_str = in_stack_ffffffffffffe620;
        message_14._M_len = (size_t)in_stack_ffffffffffffe618;
        CommsInterface::logWarning
                  ((CommsInterface *)CONCAT44(in_stack_ffffffffffffe614,in_stack_ffffffffffffe610),
                   message_14);
        std::__cxx11::string::~string
                  ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   in_stack_ffffffffffffe5a0);
        std::__cxx11::string::~string
                  ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   in_stack_ffffffffffffe5a0);
      }
      std::__cxx11::string::~string
                ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 in_stack_ffffffffffffe5a0);
      this_01 = (CommsInterface *)CONCAT44(in_stack_ffffffffffffe5b4,in_stack_ffffffffffffe5b0);
    }
    else {
      local_1704 = 3000;
      std::chrono::duration<long,std::ratio<1l,1000l>>::duration<int,void>(local_1700,&local_1704);
      uVar2 = gmlc::concurrency::TriggerVariable::wait_for
                        (in_stack_ffffffffffffe5d8,
                         (milliseconds *)CONCAT44(CVar5,in_stack_ffffffffffffe5d0));
      this_01 = (CommsInterface *)CONCAT44(in_stack_ffffffffffffe5b4,in_stack_ffffffffffffe5b0);
      if (((uVar2 ^ 0xff) & 1) != 0) {
        this_02 = local_1729;
        std::allocator<char>::allocator();
        std::__cxx11::string::string<std::allocator<char>>
                  ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   CONCAT44(in_stack_ffffffffffffe5e4,in_stack_ffffffffffffe5e0),
                   (char *)in_stack_ffffffffffffe5d8,
                   (allocator<char> *)CONCAT44(CVar5,in_stack_ffffffffffffe5d0));
        std::allocator<char>::~allocator((allocator<char> *)local_1729);
        local_1740 = (mutable_buffer)
                     asio::buffer<char,std::char_traits<char>,std::allocator<char>>
                               ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *
                                )in_stack_ffffffffffffe5a0);
        asio::basic_datagram_socket<asio::ip::udp,_asio::any_io_executor>::
        send_to<asio::mutable_buffers_1>
                  ((basic_datagram_socket<asio::ip::udp,_asio::any_io_executor> *)
                   CONCAT17(uVar2,in_stack_ffffffffffffe5c0),(mutable_buffers_1 *)this_02,
                   (endpoint_type *)CONCAT44(in_stack_ffffffffffffe5b4,in_stack_ffffffffffffe5b0),
                   in_stack_ffffffffffffe5ac,(error_code *)in_stack_ffffffffffffe5a0);
        bVar1 = std::error_code::operator_cast_to_bool(&local_740);
        if (bVar1) {
          std::error_code::message_abi_cxx11_(this_02);
          local_4f0 = local_1770;
          local_500 = "transmit failure sending close to receiver III:{}";
          uStack_4f8 = 0x31;
          local_508 = &stack0xffffffffffffe860;
          local_518 = "transmit failure sending close to receiver III:{}";
          uStack_510 = 0x31;
          ::fmt::v11::detail::value<fmt::v11::context>::
          value<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_char,_0>
                    ((value<fmt::v11::context> *)
                     CONCAT44(in_stack_ffffffffffffe5b4,in_stack_ffffffffffffe5b0),
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     CONCAT44(in_stack_ffffffffffffe5ac,in_stack_ffffffffffffe5a8));
          local_58 = &local_528;
          local_60 = local_538;
          local_528 = 0xd;
          fmt_09.size_ = in_stack_ffffffffffffe818;
          fmt_09.data_ = in_stack_ffffffffffffe810;
          args_09.field_1.values_ = in_stack_ffffffffffffe808.values_;
          args_09.desc_ = in_stack_ffffffffffffe800;
          local_520 = local_60;
          ::fmt::v11::vformat_abi_cxx11_(fmt_09,args_09);
          local_1750 = std::__cxx11::string::operator_cast_to_basic_string_view
                                 ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                   *)in_stack_ffffffffffffe5a0);
          message_12._M_str = in_stack_ffffffffffffe620;
          message_12._M_len = (size_t)in_stack_ffffffffffffe618;
          CommsInterface::logWarning
                    ((CommsInterface *)CONCAT44(in_stack_ffffffffffffe614,in_stack_ffffffffffffe610)
                     ,message_12);
          std::__cxx11::string::~string
                    ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     in_stack_ffffffffffffe5a0);
          std::__cxx11::string::~string
                    ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     in_stack_ffffffffffffe5a0);
          this_01 = (CommsInterface *)CONCAT44(in_stack_ffffffffffffe5b4,in_stack_ffffffffffffe5b0);
        }
        else {
          this_01 = (CommsInterface *)(in_RDI + 0x10);
          local_17ac = 2000;
          std::chrono::duration<long,std::ratio<1l,1000l>>::duration<int,void>
                    (local_17a8,&local_17ac);
          bVar1 = gmlc::concurrency::TriggerVariable::wait_for
                            (in_stack_ffffffffffffe5d8,
                             (milliseconds *)CONCAT44(CVar5,in_stack_ffffffffffffe5d0));
          in_stack_ffffffffffffe5ac = CONCAT13(bVar1,(int3)in_stack_ffffffffffffe5ac);
          if (((bVar1 ^ 0xffU) & 1) != 0) {
            CLI::std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
                      ((basic_string_view<char,_std::char_traits<char>_> *)this_01,
                       (char *)CONCAT44(in_stack_ffffffffffffe5ac,in_stack_ffffffffffffe5a8));
            message_13._M_str = in_stack_ffffffffffffe620;
            message_13._M_len = (size_t)in_stack_ffffffffffffe618;
            CommsInterface::logWarning
                      ((CommsInterface *)
                       CONCAT44(in_stack_ffffffffffffe614,in_stack_ffffffffffffe610),message_13);
          }
        }
        std::__cxx11::string::~string
                  ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   in_stack_ffffffffffffe5a0);
      }
    }
  }
  CommsInterface::setTxStatus(this_01,in_stack_ffffffffffffe5ac);
  local_87c = 0;
LAB_004770bf:
  std::
  map<helics::route_id,_asio::ip::basic_endpoint<asio::ip::udp>,_std::less<helics::route_id>,_std::allocator<std::pair<const_helics::route_id,_asio::ip::basic_endpoint<asio::ip::udp>_>_>_>
  ::~map((map<helics::route_id,_asio::ip::basic_endpoint<asio::ip::udp>,_std::less<helics::route_id>,_std::allocator<std::pair<const_helics::route_id,_asio::ip::basic_endpoint<asio::ip::udp>_>_>_>
          *)0x4770cc);
  asio::basic_datagram_socket<asio::ip::udp,_asio::any_io_executor>::~basic_datagram_socket
            ((basic_datagram_socket<asio::ip::udp,_asio::any_io_executor> *)0x4770d9);
  asio::ip::basic_resolver<asio::ip::udp,_asio::any_io_executor>::~basic_resolver
            ((basic_resolver<asio::ip::udp,_asio::any_io_executor> *)in_stack_ffffffffffffe5a0);
  std::shared_ptr<gmlc::networking::AsioContextManager>::~shared_ptr
            ((shared_ptr<gmlc::networking::AsioContextManager> *)0x4770f3);
  return;
}

Assistant:

void UdpComms::queue_tx_function()
{
    auto ioctx = gmlc::networking::AsioContextManager::getContextPointer();
    udp::resolver resolver(ioctx->getBaseContext());
    bool closingRx = false;
    udp::socket transmitSocket(ioctx->getBaseContext());
    transmitSocket.open(udpnet(interfaceNetwork));
    if (PortNumber >= 0) {
        promisePort.set_value(PortNumber);
    }

    std::error_code error;
    std::map<route_id, udp::endpoint> routes;  // for all the other possible routes
    udp::endpoint broker_endpoint;

    if (!brokerTargetAddress.empty()) {
        hasBroker = true;
    }
    if (hasBroker) {
        if (brokerPort < 0) {
            brokerPort = getDefaultBrokerPort();
        }
        try {
            const udp::resolver::query query(udpnet(interfaceNetwork),
                                             brokerTargetAddress,
                                             std::to_string(brokerPort));
            // Setup the control socket for comms with the receiver
            broker_endpoint = *resolver.resolve(query);
            int retries{0};
            bool connectionEstablished{false};
            if (PortNumber.load() > 0 && NetworkCommsInterface::noAckConnection) {
                connectionEstablished = true;
            }
            const decltype(std::chrono::steady_clock::now()) startTime{
                std::chrono::steady_clock::now()};
            int errorCount{0};
            while (!connectionEstablished) {
                if (requestDisconnect.load(std::memory_order_acquire)) {
                    if (PortNumber.load() <= 0) {
                        PortNumber = -1;
                        promisePort.set_value(-1);
                    }
                    setTxStatus(ConnectionStatus::TERMINATED);
                    return;
                }
                ActionMessage cmd(CMD_PROTOCOL_PRIORITY);
                cmd.messageID = (PortNumber <= 0) ? REQUEST_PORTS : CONNECTION_REQUEST;
                cmd.setStringData(brokerName, brokerInitString);
                transmitSocket.send_to(asio::buffer(cmd.to_string()), broker_endpoint, 0, error);
                if (error) {
                    logError(fmt::format("error in initial send to broker {}", error.message()));
                    if (PortNumber.load() <= 0) {
                        PortNumber = -1;
                        promisePort.set_value(-1);
                    }

                    setTxStatus(ConnectionStatus::ERRORED);
                    return;
                }

                bool timeout{false};
                std::vector<char> receiveData(128);
                udp::endpoint brk;

                while ((transmitSocket.available() == 0) && (!timeout)) {
                    if (std::chrono::steady_clock::now() - startTime > connectionTimeout) {
                        timeout = true;
                    }
                    if (requestDisconnect.load(std::memory_order_acquire)) {
                        if (PortNumber.load() <= 0) {
                            PortNumber = -1;
                            promisePort.set_value(-1);
                        }
                        setTxStatus(ConnectionStatus::TERMINATED);
                        return;
                    }
                    std::this_thread::sleep_for(std::chrono::milliseconds(50));
                }
                if (timeout) {
                    ++retries;
                    if (retries > maxRetries) {
                        logError("the max number of retries has been exceeded");
                        if (PortNumber.load() <= 0) {
                            PortNumber = -1;
                            promisePort.set_value(-1);
                        }
                        setTxStatus(ConnectionStatus::ERRORED);
                        return;
                    }
                    continue;
                }
                auto len = transmitSocket.receive_from(asio::buffer(receiveData), brk, 0, error);
                if (error) {
                    if (errorCount++ == 0) {
                        logError(
                            fmt::format("error in initial receive broker {}", error.message()));
                    }
                    if (std::chrono::steady_clock::now() - startTime > connectionTimeout) {
                        if (PortNumber.load() <= 0) {
                            PortNumber = -1;
                            promisePort.set_value(-1);
                        }
                        setTxStatus(ConnectionStatus::ERRORED);
                        logError(fmt::format("timeerror in broker receive {}", error.message()));
                        return;
                    }
                    std::this_thread::sleep_for(std::chrono::milliseconds(200));
                    continue;
                }
                cmd = ActionMessage(reinterpret_cast<std::byte*>(receiveData.data()), len);
                if (isProtocolCommand(cmd)) {
                    if (cmd.messageID == PORT_DEFINITIONS) {
                        loadPortDefinitions(cmd);
                        promisePort.set_value(PortNumber);
                        connectionEstablished = true;
                    } else if (cmd.messageID == CONNECTION_ACK) {
                        if (PortNumber.load() > 0) {
                            connectionEstablished = true;
                            continue;
                        }
                    } else if (cmd.messageID == NEW_BROKER_INFORMATION) {
                        logMessage("got new broker information");
                        auto brkprt = gmlc::networking::extractInterfaceAndPort(cmd.getString(0));
                        brokerPort = brkprt.second;
                        if (brkprt.first != "?") {
                            brokerTargetAddress = brkprt.first;
                        }
                        const udp::resolver::query localQuery(udpnet(interfaceNetwork),
                                                              brokerTargetAddress,
                                                              std::to_string(brokerPort));
                        // Setup the control socket for comms with the receiver
                        broker_endpoint = *resolver.resolve(localQuery);
                        continue;
                    } else if (cmd.messageID == DELAY_CONNECTION) {
                        std::this_thread::sleep_for(std::chrono::seconds(2));
                    } else if (cmd.messageID == DISCONNECT) {
                        if (PortNumber <= 0) {
                            PortNumber = -1;
                            promisePort.set_value(-1);
                        }
                        setTxStatus(ConnectionStatus::TERMINATED);
                        return;
                    }
                }
            }
        }
        catch (std::exception& err) {
            logError(fmt::format("error connecting to broker {}", err.what()));
            PortNumber = -1;
            promisePort.set_value(-1);
            setTxStatus(ConnectionStatus::ERRORED);
            return;
        }
    } else {
        if (PortNumber < 0) {
            PortNumber = getDefaultBrokerPort();
            promisePort.set_value(PortNumber);
        }
    }
    udp::endpoint rxEndpoint;
    if (localTargetAddress.empty() || localTargetAddress == "*" ||
        localTargetAddress == "udp://*") {
        const udp::resolver::query queryLocal(udpnet(interfaceNetwork),
                                              "127.0.0.1",
                                              std::to_string(PortNumber));
        auto result = resolver.resolve(queryLocal);
        rxEndpoint = *result;
    } else {
        const udp::resolver::query queryLocal(udpnet(interfaceNetwork),
                                              localTargetAddress,
                                              std::to_string(PortNumber));
        auto result = resolver.resolve(queryLocal, error);
        if (error) {
            logError(fmt::format("Unable to resolve: {}", localTargetAddress));
            setTxStatus(ConnectionStatus::ERRORED);
            return;
        }
        rxEndpoint = *result;
    }

    setTxStatus(ConnectionStatus::CONNECTED);
    bool continueProcessing{true};
    while (continueProcessing) {
        route_id rid;
        ActionMessage cmd;

        std::tie(rid, cmd) = txQueue.pop();
        bool processed = false;
        if (isProtocolCommand(cmd)) {
            if (rid == control_route) {
                switch (cmd.messageID) {
                    case NEW_ROUTE: {
                        try {
                            const std::string newroute(cmd.payload.to_string());
                            std::string interface;
                            std::string port;
                            std::tie(interface, port) =
                                gmlc::networking::extractInterfaceAndPortString(newroute);
                            const udp::resolver::query queryNew(udpnet(interfaceNetwork),
                                                                interface,
                                                                port);

                            routes.emplace(route_id{cmd.getExtraData()},
                                           *resolver.resolve(queryNew));
                        }
                        catch (const std::exception& err) {
                            logError(fmt::format("unable to resolve new route: {}", err.what()));
                        }
                        processed = true;
                    } break;
                    case REMOVE_ROUTE:
                        routes.erase(route_id{cmd.getExtraData()});
                        processed = true;
                        break;
                    case CLOSE_RECEIVER:
                        transmitSocket.send_to(asio::buffer(cmd.to_string()), rxEndpoint, 0, error);
                        if (error) {
                            logError(
                                fmt::format("transmit failure on sending 'close' to receiver  {}",
                                            error.message()));
                        }
                        closingRx = true;
                        processed = true;
                        break;
                    case DISCONNECT:
                        continueProcessing = false;
                        processed = true;
                        break;
                    default:
                        break;
                }
            }
        }
        if (processed) {
            continue;
        }

        if (rid == parent_route_id) {
            if (hasBroker) {
                transmitSocket.send_to(asio::buffer(cmd.to_string()), broker_endpoint, 0, error);
                if (error) {
                    logWarning(
                        fmt::format("transmit failure sending to broker  {}", error.message()));
                }
            } else {
                logWarning(fmt::format(
                    "message directed to broker of comm system with no broker, message dropped {}",
                    prettyPrintString(cmd)));
            }
        } else if (rid == control_route) {  // send to rx thread loop
            transmitSocket.send_to(asio::buffer(cmd.to_string()), rxEndpoint, 0, error);
            if (error) {
                logWarning(fmt::format("transmit failure sending control message to receiver  {}",
                                       error.message()));
            }
        } else {
            auto rt_find = routes.find(rid);
            if (rt_find != routes.end()) {
                transmitSocket.send_to(asio::buffer(cmd.to_string()), rt_find->second, 0, error);
                if (error) {
                    logWarning(fmt::format("transmit failure sending to route {}:{}",
                                           rid.baseValue(),
                                           error.message()));
                }
            } else {
                if (hasBroker) {
                    transmitSocket.send_to(asio::buffer(cmd.to_string()),
                                           broker_endpoint,
                                           0,
                                           error);
                    if (error) {
                        logWarning(
                            fmt::format("transmit failure sending to broker  {}", error.message()));
                    }
                } else {
                    if (!isDisconnectCommand(cmd)) {
                        logWarning(std::string("(udp) unknown route, message dropped ") +
                                   prettyPrintString(cmd));
                    }
                }
            }
        }
    }
    routes.clear();
    if (getRxStatus() == ConnectionStatus::CONNECTED) {
        if (closingRx) {
            if (!(rxTrigger.wait_for(std::chrono::milliseconds(3000)))) {
                std::string cls("close");
                transmitSocket.send_to(asio::buffer(cls), rxEndpoint, 0, error);
                if (error) {
                    logWarning(fmt::format("transmit failure sending close to receiver III:{}",
                                           error.message()));
                } else {
                    if (!(rxTrigger.wait_for(std::chrono::milliseconds(2000)))) {
                        logWarning("udp rx not responding to close signal");
                    }
                }
            }
        } else {
            std::string cls("close");
            transmitSocket.send_to(asio::buffer(cls), rxEndpoint, 0, error);
            if (error) {
                logWarning(fmt::format("transmit failure sending close to receiver II:{}",
                                       error.message()));
            }
        }
    }

    setTxStatus(ConnectionStatus::TERMINATED);
}